

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 *puVar2;
  int iVar3;
  BVH *bvh;
  size_t sVar4;
  Ref<embree::Geometry> *pRVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  bool bVar39;
  undefined4 uVar40;
  AABBNodeMB4D *node1;
  ulong uVar41;
  TravRayK<4,_true> *pTVar42;
  ulong uVar43;
  undefined8 uVar44;
  RTCRayQueryContext RVar45;
  int iVar46;
  TravRayK<4,_true> *tray_00;
  int iVar47;
  RTCRayQueryContext RVar48;
  RTCRayQueryContext RVar49;
  RTCRayQueryContext extraout_RDX;
  RTCRayQueryContext extraout_RDX_00;
  RTCRayQueryContext RVar50;
  RTCRayQueryContext RVar51;
  RTCRayQueryContext RVar52;
  size_t sVar53;
  long lVar54;
  ulong uVar55;
  RTCRayQueryContext RVar56;
  vuint<4> *v;
  QuadMesh *mesh;
  NodeRef *pNVar57;
  NodeRef root;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar58;
  float fVar59;
  float fVar60;
  float fVar81;
  float fVar83;
  vint4 ai;
  float fVar85;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar82;
  float fVar84;
  float fVar86;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  uint uVar87;
  uint uVar98;
  float fVar101;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar88;
  float fVar99;
  float fVar100;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar105;
  float fVar115;
  float fVar116;
  undefined1 auVar106 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar107;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar117;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar118;
  float fVar119;
  float fVar126;
  float fVar128;
  vint4 ai_1;
  undefined1 auVar120 [16];
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar132;
  float fVar138;
  float fVar139;
  vint4 ai_3;
  float fVar140;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar141;
  float fVar143;
  float fVar144;
  vint4 bi_3;
  float fVar145;
  undefined1 auVar142 [16];
  float fVar146;
  float fVar147;
  float fVar158;
  float fVar160;
  vint4 bi;
  undefined1 auVar148 [16];
  float fVar162;
  undefined1 auVar149 [16];
  float fVar159;
  float fVar161;
  float fVar163;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar164;
  float fVar169;
  float fVar171;
  vint4 bi_1;
  float fVar165;
  float fVar166;
  float fVar170;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar175;
  float fVar176;
  float fVar180;
  float fVar182;
  vint4 ai_2;
  undefined1 auVar177 [16];
  uint uVar184;
  undefined1 auVar178 [16];
  float fVar181;
  float fVar183;
  float fVar185;
  float fVar186;
  undefined1 auVar179 [16];
  uint uVar187;
  float fVar188;
  uint uVar191;
  uint uVar193;
  vint4 bi_2;
  float fVar192;
  float fVar194;
  uint uVar195;
  float fVar196;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  uint uVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  uint uVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  uint uVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  uint uVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar201 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar247;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float local_1b28;
  float fStack_1b24;
  float fStack_1b20;
  float fStack_1b1c;
  uint local_1b18;
  uint uStack_1b14;
  uint uStack_1b10;
  uint uStack_1b0c;
  float local_1b08;
  float fStack_1b04;
  float fStack_1b00;
  float fStack_1afc;
  Vec3<embree::vfloat_impl<4>_> p1;
  Precalculations pre;
  undefined1 local_1a68 [16];
  int local_1a4c;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  float local_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float local_1948;
  float fStack_1944;
  float fStack_1940;
  float fStack_193c;
  float local_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  vint<4> itime;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  vfloat<4> t;
  vfloat<4> v_1;
  vfloat<4> u;
  TravRayK<4,_true> tray;
  float local_1778;
  float fStack_1774;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar89 [16];
  
  uVar24 = mm_lookupmask_ps._248_8_;
  uVar23 = mm_lookupmask_ps._240_8_;
  uVar22 = mm_lookupmask_ps._8_8_;
  uVar21 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar148 = *(undefined1 (*) [16])(ray + 0x80);
    auVar65._0_12_ = ZEXT812(0);
    auVar65._12_4_ = 0;
    uVar87 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar148._0_4_);
    uVar98 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar148._4_4_);
    auVar89._0_8_ = CONCAT44(uVar98,uVar87);
    auVar89._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar148._8_4_);
    auVar89._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar148._12_4_);
    iVar46 = movmskps((int)context,auVar89);
    if (iVar46 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      uVar197 = (uint)DAT_01f46710;
      uVar202 = DAT_01f46710._4_4_;
      uVar207 = DAT_01f46710._8_4_;
      uVar212 = DAT_01f46710._12_4_;
      auVar177 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar106._4_4_ = -(uint)((float)(tray.dir.field_0._4_4_ & uVar202) < 1e-18);
      auVar106._0_4_ = -(uint)((float)(tray.dir.field_0._0_4_ & uVar197) < 1e-18);
      auVar106._8_4_ = -(uint)((float)(tray.dir.field_0._8_4_ & uVar207) < 1e-18);
      auVar106._12_4_ = -(uint)((float)(tray.dir.field_0._12_4_ & uVar212) < 1e-18);
      auVar120 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar168._4_4_ = -(uint)((float)(tray.dir.field_0._20_4_ & uVar202) < 1e-18);
      auVar168._0_4_ = -(uint)((float)(tray.dir.field_0._16_4_ & uVar197) < 1e-18);
      auVar90 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)blendvps(auVar177,_DAT_01f76a70,auVar106);
      auVar168._8_4_ = -(uint)((float)(tray.dir.field_0._24_4_ & uVar207) < 1e-18);
      auVar168._12_4_ = -(uint)((float)(tray.dir.field_0._28_4_ & uVar212) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)blendvps(auVar120,_DAT_01f76a70,auVar168);
      auVar120._4_4_ = -(uint)((float)(tray.dir.field_0._36_4_ & uVar202) < 1e-18);
      auVar120._0_4_ = -(uint)((float)(tray.dir.field_0._32_4_ & uVar197) < 1e-18);
      auVar120._8_4_ = -(uint)((float)(tray.dir.field_0._40_4_ & uVar207) < 1e-18);
      auVar120._12_4_ = -(uint)((float)(tray.dir.field_0._44_4_ & uVar212) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar90,_DAT_01f76a70,auVar120)
      ;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar90._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar90._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar90._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar90._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar90);
      auVar177._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar177._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar177._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar177._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar177);
      auVar106 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar65);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar106,auVar89);
      auVar148 = maxps(auVar148,auVar65);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar148,auVar89);
      terminated.field_0._0_8_ = auVar89._0_8_ ^ 0xffffffffffffffff;
      terminated.field_0.i[2] = auVar89._8_4_ ^ 0xffffffff;
      terminated.field_0.i[3] = auVar89._12_4_ ^ 0xffffffff;
      if (context->user == (RTCRayQueryContext *)0x0) {
        RVar48.instID[0] = 3;
        RVar48.instPrimID[0] = 0;
        tray_00 = (TravRayK<4,_true> *)context;
      }
      else {
        tray_00 = (TravRayK<4,_true> *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        RVar48 = (RTCRayQueryContext)((ulong)((char)tray_00 == '\0') + 2);
      }
      pNVar57 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar58 = &stack_near[2].field_0;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0._8_8_ = 0x7f8000007f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar197 = 0x2223f80;
      RVar49 = RVar48;
LAB_006cfa5a:
      do {
        do {
          root.ptr = pNVar57[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006d15aa;
          pNVar57 = pNVar57 + -1;
          paVar58 = paVar58 + -1;
          aVar107.v = *(__m128 *)paVar58->v;
          auVar148._4_4_ = -(uint)(aVar107._4_4_ < tray.tfar.field_0.v[1]);
          auVar148._0_4_ = -(uint)(aVar107._0_4_ < tray.tfar.field_0.v[0]);
          auVar148._8_4_ = -(uint)(aVar107._8_4_ < tray.tfar.field_0.v[2]);
          auVar148._12_4_ = -(uint)(aVar107._12_4_ < tray.tfar.field_0.v[3]);
          uVar197 = movmskps(uVar197,auVar148);
        } while (uVar197 == 0);
        uVar41 = (ulong)(byte)uVar197;
        RVar52.instID[0] = POPCOUNT(uVar197 & 0xff);
        RVar52.instPrimID[0] = 0;
        if ((ulong)RVar48 < (ulong)RVar52) {
LAB_006cfa9e:
          RVar56.instID[0] = 0xfffffff0;
          RVar56.instPrimID[0] = 0xffffffff;
          do {
            fVar60 = aVar107.v[0];
            fVar82 = aVar107.v[1];
            fVar84 = aVar107.v[2];
            fVar86 = aVar107.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006d15aa;
              auVar63._4_4_ = -(uint)(fVar82 < tray.tfar.field_0.v[1]);
              auVar63._0_4_ = -(uint)(fVar60 < tray.tfar.field_0.v[0]);
              auVar63._8_4_ = -(uint)(fVar84 < tray.tfar.field_0.v[2]);
              auVar63._12_4_ = -(uint)(fVar86 < tray.tfar.field_0.v[3]);
              uVar197 = movmskps(uVar197,auVar63);
              if (uVar197 == 0) goto LAB_006cfa5a;
              auVar149._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar149._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              auVar149._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              pTVar42 = (TravRayK<4,_true> *)0x0;
              goto LAB_006cfd7a;
            }
            uVar41 = root.ptr & 0xfffffffffffffff0;
            uVar197 = (uint)root.ptr & 7;
            tray_00 = (TravRayK<4,_true> *)(ulong)uVar197;
            RVar49 = RVar56;
            root.ptr = 8;
            aVar107 = _DAT_01f45a30;
            while( true ) {
              if ((RVar49 == (RTCRayQueryContext)0x0) ||
                 (sVar4 = *(size_t *)(uVar41 + 0x20 + (long)RVar49 * 2), sVar4 == 8)) break;
              fVar85 = *(float *)(uVar41 + 0x90 + (long)RVar49);
              fVar118 = *(float *)(uVar41 + 0x30 + (long)RVar49);
              fVar141 = *(float *)(uVar41 + 0x40 + (long)RVar49);
              fVar130 = *(float *)(uVar41 + 0x50 + (long)RVar49);
              fVar143 = *(float *)(uVar41 + 0x60 + (long)RVar49);
              fVar175 = *(float *)(ray + 0x70);
              fVar180 = *(float *)(ray + 0x74);
              fVar182 = *(float *)(ray + 0x78);
              fVar185 = *(float *)(ray + 0x7c);
              fVar132 = *(float *)(uVar41 + 0xb0 + (long)RVar49);
              fVar140 = *(float *)(uVar41 + 0xd0 + (long)RVar49);
              fVar144 = *(float *)(uVar41 + 0x70 + (long)RVar49);
              fVar145 = *(float *)(uVar41 + 0xa0 + (long)RVar49);
              fVar173 = *(float *)(uVar41 + 0xc0 + (long)RVar49);
              fVar238 = *(float *)(uVar41 + 0xe0 + (long)RVar49);
              fVar239 = *(float *)(uVar41 + 0x80 + (long)RVar49);
              fVar203 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
              fVar213 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
              fVar59 = ((fVar85 * fVar175 + fVar118) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar81 = ((fVar85 * fVar180 + fVar118) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar83 = ((fVar85 * fVar182 + fVar118) - (float)tray.org.field_0._8_4_) *
                       (float)tray.rdir.field_0._8_4_;
              fVar85 = ((fVar85 * fVar185 + fVar118) - (float)tray.org.field_0._12_4_) *
                       (float)tray.rdir.field_0._12_4_;
              fVar118 = ((fVar132 * fVar175 + fVar130) - (float)tray.org.field_0._16_4_) *
                        tray.rdir.field_0._16_4_;
              fVar126 = ((fVar132 * fVar180 + fVar130) - (float)tray.org.field_0._20_4_) *
                        tray.rdir.field_0._20_4_;
              fVar128 = ((fVar132 * fVar182 + fVar130) - (float)tray.org.field_0._24_4_) *
                        tray.rdir.field_0._24_4_;
              fVar130 = ((fVar132 * fVar185 + fVar130) - (float)tray.org.field_0._28_4_) *
                        tray.rdir.field_0._28_4_;
              fVar132 = ((fVar140 * fVar175 + fVar144) - (float)tray.org.field_0._32_8_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar138 = ((fVar140 * fVar180 + fVar144) - fVar203) * (float)tray.rdir.field_0._36_4_;
              fVar139 = ((fVar140 * fVar182 + fVar144) - (float)tray.org.field_0._40_8_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar140 = ((fVar140 * fVar185 + fVar144) - fVar213) * (float)tray.rdir.field_0._44_4_;
              fVar146 = ((fVar145 * fVar175 + fVar141) - (float)tray.org.field_0._0_4_) *
                        (float)tray.rdir.field_0._0_4_;
              fVar158 = ((fVar145 * fVar180 + fVar141) - (float)tray.org.field_0._4_4_) *
                        (float)tray.rdir.field_0._4_4_;
              fVar160 = ((fVar145 * fVar182 + fVar141) - (float)tray.org.field_0._8_4_) *
                        (float)tray.rdir.field_0._8_4_;
              fVar162 = ((fVar145 * fVar185 + fVar141) - (float)tray.org.field_0._12_4_) *
                        (float)tray.rdir.field_0._12_4_;
              fVar164 = ((fVar173 * fVar175 + fVar143) - (float)tray.org.field_0._16_4_) *
                        tray.rdir.field_0._16_4_;
              fVar169 = ((fVar173 * fVar180 + fVar143) - (float)tray.org.field_0._20_4_) *
                        tray.rdir.field_0._20_4_;
              fVar171 = ((fVar173 * fVar182 + fVar143) - (float)tray.org.field_0._24_4_) *
                        tray.rdir.field_0._24_4_;
              fVar173 = ((fVar173 * fVar185 + fVar143) - (float)tray.org.field_0._28_4_) *
                        tray.rdir.field_0._28_4_;
              fVar141 = ((fVar238 * fVar175 + fVar239) - (float)tray.org.field_0._32_8_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar143 = ((fVar238 * fVar180 + fVar239) - fVar203) * (float)tray.rdir.field_0._36_4_;
              fVar144 = ((fVar238 * fVar182 + fVar239) - (float)tray.org.field_0._40_8_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar145 = ((fVar238 * fVar185 + fVar239) - fVar213) * (float)tray.rdir.field_0._44_4_;
              uVar202 = (uint)((int)fVar146 < (int)fVar59) * (int)fVar146 |
                        (uint)((int)fVar146 >= (int)fVar59) * (int)fVar59;
              uVar207 = (uint)((int)fVar158 < (int)fVar81) * (int)fVar158 |
                        (uint)((int)fVar158 >= (int)fVar81) * (int)fVar81;
              uVar212 = (uint)((int)fVar160 < (int)fVar83) * (int)fVar160 |
                        (uint)((int)fVar160 >= (int)fVar83) * (int)fVar83;
              uVar184 = (uint)((int)fVar162 < (int)fVar85) * (int)fVar162 |
                        (uint)((int)fVar162 >= (int)fVar85) * (int)fVar85;
              uVar187 = (uint)((int)fVar164 < (int)fVar118) * (int)fVar164 |
                        (uint)((int)fVar164 >= (int)fVar118) * (int)fVar118;
              uVar191 = (uint)((int)fVar169 < (int)fVar126) * (int)fVar169 |
                        (uint)((int)fVar169 >= (int)fVar126) * (int)fVar126;
              uVar193 = (uint)((int)fVar171 < (int)fVar128) * (int)fVar171 |
                        (uint)((int)fVar171 >= (int)fVar128) * (int)fVar128;
              uVar195 = (uint)((int)fVar173 < (int)fVar130) * (int)fVar173 |
                        (uint)((int)fVar173 >= (int)fVar130) * (int)fVar130;
              uVar187 = ((int)uVar187 < (int)uVar202) * uVar202 |
                        ((int)uVar187 >= (int)uVar202) * uVar187;
              uVar191 = ((int)uVar191 < (int)uVar207) * uVar207 |
                        ((int)uVar191 >= (int)uVar207) * uVar191;
              uVar193 = ((int)uVar193 < (int)uVar212) * uVar212 |
                        ((int)uVar193 >= (int)uVar212) * uVar193;
              uVar195 = ((int)uVar195 < (int)uVar184) * uVar184 |
                        ((int)uVar195 >= (int)uVar184) * uVar195;
              uVar202 = (uint)((int)fVar141 < (int)fVar132) * (int)fVar141 |
                        (uint)((int)fVar141 >= (int)fVar132) * (int)fVar132;
              uVar207 = (uint)((int)fVar143 < (int)fVar138) * (int)fVar143 |
                        (uint)((int)fVar143 >= (int)fVar138) * (int)fVar138;
              uVar212 = (uint)((int)fVar144 < (int)fVar139) * (int)fVar144 |
                        (uint)((int)fVar144 >= (int)fVar139) * (int)fVar139;
              uVar184 = (uint)((int)fVar145 < (int)fVar140) * (int)fVar145 |
                        (uint)((int)fVar145 >= (int)fVar140) * (int)fVar140;
              auVar178._0_4_ =
                   (float)(((int)uVar202 < (int)uVar187) * uVar187 |
                          ((int)uVar202 >= (int)uVar187) * uVar202) * 0.99999964;
              auVar178._4_4_ =
                   (float)(((int)uVar207 < (int)uVar191) * uVar191 |
                          ((int)uVar207 >= (int)uVar191) * uVar207) * 0.99999964;
              auVar178._8_4_ =
                   (float)(((int)uVar212 < (int)uVar193) * uVar193 |
                          ((int)uVar212 >= (int)uVar193) * uVar212) * 0.99999964;
              auVar178._12_4_ =
                   (float)(((int)uVar184 < (int)uVar195) * uVar195 |
                          ((int)uVar184 >= (int)uVar195) * uVar184) * 0.99999964;
              uVar202 = (uint)((int)fVar146 < (int)fVar59) * (int)fVar59 |
                        (uint)((int)fVar146 >= (int)fVar59) * (int)fVar146;
              uVar207 = (uint)((int)fVar158 < (int)fVar81) * (int)fVar81 |
                        (uint)((int)fVar158 >= (int)fVar81) * (int)fVar158;
              uVar212 = (uint)((int)fVar160 < (int)fVar83) * (int)fVar83 |
                        (uint)((int)fVar160 >= (int)fVar83) * (int)fVar160;
              uVar184 = (uint)((int)fVar162 < (int)fVar85) * (int)fVar85 |
                        (uint)((int)fVar162 >= (int)fVar85) * (int)fVar162;
              uVar187 = (uint)((int)fVar164 < (int)fVar118) * (int)fVar118 |
                        (uint)((int)fVar164 >= (int)fVar118) * (int)fVar164;
              uVar191 = (uint)((int)fVar169 < (int)fVar126) * (int)fVar126 |
                        (uint)((int)fVar169 >= (int)fVar126) * (int)fVar169;
              uVar193 = (uint)((int)fVar171 < (int)fVar128) * (int)fVar128 |
                        (uint)((int)fVar171 >= (int)fVar128) * (int)fVar171;
              uVar195 = (uint)((int)fVar173 < (int)fVar130) * (int)fVar130 |
                        (uint)((int)fVar173 >= (int)fVar130) * (int)fVar173;
              uVar187 = ((int)uVar202 < (int)uVar187) * uVar202 |
                        ((int)uVar202 >= (int)uVar187) * uVar187;
              uVar191 = ((int)uVar207 < (int)uVar191) * uVar207 |
                        ((int)uVar207 >= (int)uVar191) * uVar191;
              uVar193 = ((int)uVar212 < (int)uVar193) * uVar212 |
                        ((int)uVar212 >= (int)uVar193) * uVar193;
              uVar195 = ((int)uVar184 < (int)uVar195) * uVar184 |
                        ((int)uVar184 >= (int)uVar195) * uVar195;
              uVar202 = (uint)((int)fVar141 < (int)fVar132) * (int)fVar132 |
                        (uint)((int)fVar141 >= (int)fVar132) * (int)fVar141;
              uVar207 = (uint)((int)fVar143 < (int)fVar138) * (int)fVar138 |
                        (uint)((int)fVar143 >= (int)fVar138) * (int)fVar143;
              uVar212 = (uint)((int)fVar144 < (int)fVar139) * (int)fVar139 |
                        (uint)((int)fVar144 >= (int)fVar139) * (int)fVar144;
              uVar184 = (uint)((int)fVar145 < (int)fVar140) * (int)fVar140 |
                        (uint)((int)fVar145 >= (int)fVar140) * (int)fVar145;
              fVar85 = (float)(((int)uVar187 < (int)uVar202) * uVar187 |
                              ((int)uVar187 >= (int)uVar202) * uVar202) * 1.0000004;
              fVar118 = (float)(((int)uVar191 < (int)uVar207) * uVar191 |
                               ((int)uVar191 >= (int)uVar207) * uVar207) * 1.0000004;
              fVar141 = (float)(((int)uVar193 < (int)uVar212) * uVar193 |
                               ((int)uVar193 >= (int)uVar212) * uVar212) * 1.0000004;
              fVar130 = (float)(((int)uVar195 < (int)uVar184) * uVar195 |
                               ((int)uVar195 >= (int)uVar184) * uVar184) * 1.0000004;
              bVar39 = (float)((uint)(tray.tnear.field_0.i[0] < (int)auVar178._0_4_) *
                               (int)auVar178._0_4_ |
                              (uint)(tray.tnear.field_0.i[0] >= (int)auVar178._0_4_) *
                              tray.tnear.field_0.i[0]) <=
                       (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar85) * tray.tfar.field_0.i[0]
                              | (uint)(tray.tfar.field_0.i[0] >= (int)fVar85) * (int)fVar85);
              bVar8 = (float)((uint)(tray.tnear.field_0.i[1] < (int)auVar178._4_4_) *
                              (int)auVar178._4_4_ |
                             (uint)(tray.tnear.field_0.i[1] >= (int)auVar178._4_4_) *
                             tray.tnear.field_0.i[1]) <=
                      (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar118) * tray.tfar.field_0.i[1]
                             | (uint)(tray.tfar.field_0.i[1] >= (int)fVar118) * (int)fVar118);
              bVar9 = (float)((uint)(tray.tnear.field_0.i[2] < (int)auVar178._8_4_) *
                              (int)auVar178._8_4_ |
                             (uint)(tray.tnear.field_0.i[2] >= (int)auVar178._8_4_) *
                             tray.tnear.field_0.i[2]) <=
                      (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar141) * tray.tfar.field_0.i[2]
                             | (uint)(tray.tfar.field_0.i[2] >= (int)fVar141) * (int)fVar141);
              bVar10 = (float)((uint)(tray.tnear.field_0.i[3] < (int)auVar178._12_4_) *
                               (int)auVar178._12_4_ |
                              (uint)(tray.tnear.field_0.i[3] >= (int)auVar178._12_4_) *
                              tray.tnear.field_0.i[3]) <=
                       (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar130) *
                               tray.tfar.field_0.i[3] |
                              (uint)(tray.tfar.field_0.i[3] >= (int)fVar130) * (int)fVar130);
              if (uVar197 == 6) {
                fVar85 = *(float *)(uVar41 + 0xf0 + (long)RVar49);
                fVar118 = *(float *)(uVar41 + 0x100 + (long)RVar49);
                bVar39 = (fVar175 < fVar118 && fVar85 <= fVar175) && bVar39;
                bVar8 = (fVar180 < fVar118 && fVar85 <= fVar180) && bVar8;
                bVar9 = (fVar182 < fVar118 && fVar85 <= fVar182) && bVar9;
                bVar10 = (fVar185 < fVar118 && fVar85 <= fVar185) && bVar10;
              }
              auVar61._0_4_ = (-(uint)bVar39 & -(uint)(fVar60 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar61._4_4_ = (-(uint)bVar8 & -(uint)(fVar82 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar61._8_4_ = (-(uint)bVar9 & -(uint)(fVar84 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar61._12_4_ = (-(uint)bVar10 & -(uint)(fVar86 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar202 = movmskps((int)valid_i,auVar61);
              valid_i = (vint<4> *)(ulong)uVar202;
              sVar53 = root.ptr;
              aVar108 = aVar107;
              if ((uVar202 != 0) &&
                 (aVar108.v = (__m128)blendvps(_DAT_01f45a30,auVar178,auVar61), sVar53 = sVar4,
                 root.ptr != 8)) {
                pNVar57->ptr = root.ptr;
                pNVar57 = pNVar57 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar58->v = aVar107;
                paVar58 = paVar58 + 1;
              }
              RVar49 = (RTCRayQueryContext)((long)RVar49 + 4);
              root.ptr = sVar53;
              aVar107 = aVar108;
            }
            if (root.ptr == 8) goto LAB_006cfd21;
            auVar62._4_4_ = -(uint)(aVar107.v[1] < tray.tfar.field_0.v[1]);
            auVar62._0_4_ = -(uint)(aVar107.v[0] < tray.tfar.field_0.v[0]);
            auVar62._8_4_ = -(uint)(aVar107.v[2] < tray.tfar.field_0.v[2]);
            auVar62._12_4_ = -(uint)(aVar107.v[3] < tray.tfar.field_0.v[3]);
            uVar40 = movmskps((int)uVar41,auVar62);
            uVar197 = POPCOUNT(uVar40);
          } while ((byte)RVar48.instID[0] < (byte)uVar197);
          pNVar57->ptr = root.ptr;
          pNVar57 = pNVar57 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar58->v = aVar107;
          paVar58 = paVar58 + 1;
LAB_006cfd21:
          uVar197 = 4;
        }
        else {
          while (uVar41 != 0) {
            sVar4 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> sVar4 & 1) == 0; sVar4 = sVar4 + 1) {
              }
            }
            uVar41 = uVar41 & uVar41 - 1;
            tray_00 = &tray;
            valid_i = (vint<4> *)This;
            RVar49 = (RTCRayQueryContext)context;
            bVar39 = occluded1(This,bvh,root,sVar4,&pre,ray,tray_00,context);
            if (bVar39) {
              terminated.field_0.i[sVar4] = -1;
            }
          }
          uVar202 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          tray_00 = (TravRayK<4,_true> *)(ulong)uVar202;
          uVar197 = 3;
          if (uVar202 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            uVar197 = 2;
          }
          if ((ulong)RVar48 < (ulong)RVar52) goto LAB_006cfa9e;
        }
      } while (uVar197 != 3);
LAB_006d15aa:
      auVar80._0_4_ = uVar87 & terminated.field_0.i[0];
      auVar80._4_4_ = uVar98 & terminated.field_0.i[1];
      auVar80._8_4_ = auVar89._8_4_ & terminated.field_0.i[2];
      auVar80._12_4_ = auVar89._12_4_ & terminated.field_0.i[3];
      auVar148 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar80);
      *(undefined1 (*) [16])(ray + 0x80) = auVar148;
    }
  }
  return;
LAB_006cfd7a:
  do {
    auVar156 = auVar149;
    if (pTVar42 == (TravRayK<4,_true> *)((ulong)((uint)root.ptr & 0xf) - 8)) break;
    lVar54 = (long)pTVar42 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    uVar40 = movmskps((int)pTVar42,auVar149);
    uVar43 = CONCAT44((int)((ulong)pTVar42 >> 0x20),uVar40);
    valid_i = (vint<4> *)0x0;
    uVar41 = uVar43;
    auVar148 = auVar149;
    do {
      iVar46 = (int)uVar41;
      if (((Intersectors *)valid_i == (Intersectors *)&DAT_00000004) ||
         (iVar46 = *(int *)(lVar54 + 0x50 + (long)valid_i * 4), iVar46 == -1)) goto LAB_006d1490;
      RVar52 = *(RTCRayQueryContext *)
                ((context->scene->geometries).items + *(uint *)(lVar54 + 0x40 + (long)valid_i * 4));
      fVar60 = *(float *)((long)RVar52 + 0x28);
      fVar82 = ((BBox1f *)((long)RVar52 + 0x2c))->lower;
      auVar109._0_4_ = *(float *)&((RayQueryContext *)((long)RVar52 + 0x30))->scene - fVar82;
      auVar64._0_4_ = *(float *)(ray + 0x70) - fVar82;
      auVar64._4_4_ = *(float *)(ray + 0x74) - fVar82;
      auVar64._8_4_ = *(float *)(ray + 0x78) - fVar82;
      auVar64._12_4_ = *(float *)(ray + 0x7c) - fVar82;
      auVar109._4_4_ = auVar109._0_4_;
      auVar109._8_4_ = auVar109._0_4_;
      auVar109._12_4_ = auVar109._0_4_;
      auVar65 = divps(auVar64,auVar109);
      auVar66._0_4_ = auVar65._0_4_ * fVar60;
      auVar66._4_4_ = auVar65._4_4_ * fVar60;
      auVar66._8_4_ = auVar65._8_4_ * fVar60;
      auVar66._12_4_ = auVar65._12_4_ * fVar60;
      auVar65 = roundps(auVar109,auVar66,1);
      auVar91._0_4_ = fVar60 + -1.0;
      auVar91._4_4_ = auVar91._0_4_;
      auVar91._8_4_ = auVar91._0_4_;
      auVar91._12_4_ = auVar91._0_4_;
      auVar65 = minps(auVar65,auVar91);
      auVar65 = maxps(auVar65,ZEXT816(0));
      fVar60 = auVar66._0_4_ - auVar65._0_4_;
      fVar82 = auVar66._4_4_ - auVar65._4_4_;
      fVar84 = auVar66._8_4_ - auVar65._8_4_;
      fVar86 = auVar66._12_4_ - auVar65._12_4_;
      itime.field_0.i[0] = (int)auVar65._0_4_;
      itime.field_0.i[1] = (int)auVar65._4_4_;
      itime.field_0.i[2] = (int)auVar65._8_4_;
      itime.field_0.i[3] = (int)auVar65._12_4_;
      RVar45.instID[0] = 0;
      RVar45.instPrimID[0] = 0;
      if (uVar43 != 0) {
        for (; (uVar43 >> (long)RVar45 & 1) == 0; RVar45 = (RTCRayQueryContext)((long)RVar45 + 1)) {
        }
      }
      iVar3 = itime.field_0.i[(long)RVar45];
      auVar110._0_4_ = -(uint)(iVar3 == itime.field_0.i[0]);
      auVar110._4_4_ = -(uint)(iVar3 == itime.field_0.i[1]);
      auVar110._8_4_ = -(uint)(iVar3 == itime.field_0.i[2]);
      auVar110._12_4_ = -(uint)(iVar3 == itime.field_0.i[3]);
      iVar47 = movmskps(RVar49.instID[0],~auVar110 & auVar149);
      uVar41 = uVar43;
      RVar50 = RVar45;
      local_1a4c = iVar46;
      if (iVar47 == 0) {
        RVar45 = (*(RTCRayQueryContext **)((long)RVar52 + 0xe0))[(long)iVar3 * 7];
        RVar56 = (*(RTCRayQueryContext **)((long)RVar52 + 0xe0))[(long)iVar3 * 7 + 7];
        uVar55 = (ulong)*(uint *)(lVar54 + (long)valid_i * 4);
        uVar41 = (ulong)*(uint *)(lVar54 + 0x10 + (long)valid_i * 4);
        pfVar1 = (float *)((long)RVar45 + uVar55 * 4);
        fVar85 = *pfVar1;
        fVar118 = pfVar1[1];
        fVar141 = pfVar1[2];
        pfVar1 = (float *)((long)RVar56 + uVar55 * 4);
        fVar130 = *pfVar1;
        fVar143 = pfVar1[1];
        fVar144 = pfVar1[2];
        fVar88 = 1.0 - fVar60;
        fVar99 = 1.0 - fVar82;
        fVar101 = 1.0 - fVar84;
        fVar103 = 1.0 - fVar86;
        local_1b08 = fVar85 * fVar88 + fVar130 * fVar60;
        fStack_1b04 = fVar85 * fVar99 + fVar130 * fVar82;
        fStack_1b00 = fVar85 * fVar101 + fVar130 * fVar84;
        fStack_1afc = fVar85 * fVar103 + fVar130 * fVar86;
        fVar145 = fVar118 * fVar88 + fVar143 * fVar60;
        fVar173 = fVar118 * fVar99 + fVar143 * fVar82;
        fVar238 = fVar118 * fVar101 + fVar143 * fVar84;
        fVar239 = fVar118 * fVar103 + fVar143 * fVar86;
        fVar143 = fVar141 * fVar88 + fVar144 * fVar60;
        fVar132 = fVar141 * fVar99 + fVar144 * fVar82;
        fVar140 = fVar141 * fVar101 + fVar144 * fVar84;
        fVar144 = fVar141 * fVar103 + fVar144 * fVar86;
        pfVar1 = (float *)((long)RVar45 + uVar41 * 4);
        fVar85 = *pfVar1;
        fVar118 = pfVar1[1];
        fVar141 = pfVar1[2];
        pfVar1 = (float *)((long)RVar56 + uVar41 * 4);
        fVar130 = *pfVar1;
        fVar175 = pfVar1[1];
        fVar185 = pfVar1[2];
        fVar128 = fVar85 * fVar88 + fVar130 * fVar60;
        fVar138 = fVar85 * fVar99 + fVar130 * fVar82;
        fVar139 = fVar85 * fVar101 + fVar130 * fVar84;
        fVar146 = fVar85 * fVar103 + fVar130 * fVar86;
        fVar59 = fVar118 * fVar88 + fVar175 * fVar60;
        fVar81 = fVar118 * fVar99 + fVar175 * fVar82;
        fVar83 = fVar118 * fVar101 + fVar175 * fVar84;
        fVar126 = fVar118 * fVar103 + fVar175 * fVar86;
        fVar175 = fVar141 * fVar88 + fVar185 * fVar60;
        fVar180 = fVar141 * fVar99 + fVar185 * fVar82;
        fVar182 = fVar141 * fVar101 + fVar185 * fVar84;
        fVar185 = fVar141 * fVar103 + fVar185 * fVar86;
        uVar41 = (ulong)*(uint *)(lVar54 + 0x20 + (long)valid_i * 4);
        pfVar1 = (float *)((long)RVar45 + uVar41 * 4);
        fVar85 = *pfVar1;
        fVar118 = pfVar1[1];
        fVar141 = pfVar1[2];
        pfVar1 = (float *)((long)RVar56 + uVar41 * 4);
        fVar130 = *pfVar1;
        fVar158 = pfVar1[1];
        fVar160 = pfVar1[2];
        local_1938 = fVar85 * fVar88 + fVar130 * fVar60;
        fStack_1934 = fVar85 * fVar99 + fVar130 * fVar82;
        fStack_1930 = fVar85 * fVar101 + fVar130 * fVar84;
        fStack_192c = fVar85 * fVar103 + fVar130 * fVar86;
        local_1958 = fVar118 * fVar88 + fVar158 * fVar60;
        fStack_1954 = fVar118 * fVar99 + fVar158 * fVar82;
        fStack_1950 = fVar118 * fVar101 + fVar158 * fVar84;
        fStack_194c = fVar118 * fVar103 + fVar158 * fVar86;
        local_1948 = fVar141 * fVar88 + fVar160 * fVar60;
        fStack_1944 = fVar141 * fVar99 + fVar160 * fVar82;
        fStack_1940 = fVar141 * fVar101 + fVar160 * fVar84;
        fStack_193c = fVar141 * fVar103 + fVar160 * fVar86;
        RVar49.instPrimID[0] = 0;
        RVar49.instID[0] = *(uint *)(lVar54 + 0x30 + (long)valid_i * 4);
        pfVar1 = (float *)((long)RVar45 + (long)RVar49 * 4);
        fVar85 = *pfVar1;
        fVar118 = pfVar1[1];
        fVar141 = pfVar1[2];
        pfVar1 = (float *)((long)RVar56 + (long)RVar49 * 4);
        fVar130 = *pfVar1;
        fVar213 = pfVar1[1];
        fVar166 = pfVar1[2];
        fVar158 = fVar85 * fVar88 + fVar130 * fVar60;
        fVar160 = fVar85 * fVar99 + fVar130 * fVar82;
        fVar162 = fVar85 * fVar101 + fVar130 * fVar84;
        fVar164 = fVar85 * fVar103 + fVar130 * fVar86;
        fVar169 = fVar118 * fVar88 + fVar213 * fVar60;
        fVar171 = fVar118 * fVar99 + fVar213 * fVar82;
        fVar203 = fVar118 * fVar101 + fVar213 * fVar84;
        fVar213 = fVar118 * fVar103 + fVar213 * fVar86;
        fVar60 = fVar141 * fVar88 + fVar166 * fVar60;
        fVar82 = fVar141 * fVar99 + fVar166 * fVar82;
        fVar84 = fVar141 * fVar101 + fVar166 * fVar84;
        fVar86 = fVar141 * fVar103 + fVar166 * fVar86;
      }
      else {
        while (uVar41 != 0) {
          uVar55 = (ulong)*(uint *)(lVar54 + (long)valid_i * 4);
          auVar65 = *(undefined1 (*) [16])
                     ((long)(*(RTCRayQueryContext **)((long)RVar52 + 0xe0))
                            [(long)itime.field_0.i[(long)RVar50] * 7] + uVar55 * 4);
          auVar106 = *(undefined1 (*) [16])
                      ((long)(*(RTCRayQueryContext **)((long)RVar52 + 0xe0))
                             [(long)itime.field_0.i[(long)RVar50] * 7 + 7] + uVar55 * 4);
          *(int *)((long)&p0.field_0 + (long)RVar50 * 4) = auVar65._0_4_;
          uVar44 = extractps(auVar65,1);
          *(undefined8 *)((long)&p0.field_0 + (long)RVar50 * 4 + 0x10) = uVar44;
          uVar44 = extractps(auVar65,2);
          *(undefined8 *)((long)&p0.field_0 + (long)RVar50 * 4 + 0x20) = uVar44;
          *(int *)((long)&p1.field_0 + (long)RVar50 * 4) = auVar106._0_4_;
          uVar44 = extractps(auVar106,1);
          *(undefined8 *)((long)&p1.field_0 + (long)RVar50 * 4 + 0x10) = uVar44;
          uVar44 = extractps(auVar106,2);
          *(undefined8 *)((long)&p1.field_0 + (long)RVar50 * 4 + 0x20) = uVar44;
          uVar41 = uVar41 ^ 1L << ((ulong)RVar50 & 0x3f);
          RVar50.instID[0] = 0;
          RVar50.instPrimID[0] = 0;
          if (uVar41 != 0) {
            for (; (uVar41 >> (long)RVar50 & 1) == 0;
                RVar50 = (RTCRayQueryContext)((long)RVar50 + 1)) {
            }
          }
        }
        fVar85 = 1.0 - fVar60;
        fVar118 = 1.0 - fVar82;
        fVar141 = 1.0 - fVar84;
        fVar130 = 1.0 - fVar86;
        uVar28 = p0.field_0._0_4_;
        uVar29 = p0.field_0._4_4_;
        uVar30 = p0.field_0._8_4_;
        uVar31 = p0.field_0._12_4_;
        uVar32 = p0.field_0._32_4_;
        uVar33 = p0.field_0._36_4_;
        uVar34 = p0.field_0._40_4_;
        uVar36 = p0.field_0._44_4_;
        uVar40 = p1.field_0._0_4_;
        uVar25 = p1.field_0._4_4_;
        uVar26 = p1.field_0._8_4_;
        uVar27 = p1.field_0._12_4_;
        fVar145 = (float)p1.field_0._16_4_ * fVar60 + (float)p0.field_0._16_4_ * fVar85;
        fVar173 = (float)p1.field_0._20_4_ * fVar82 + (float)p0.field_0._20_4_ * fVar118;
        fVar238 = (float)p1.field_0._24_4_ * fVar84 + (float)p0.field_0._24_4_ * fVar141;
        fVar239 = (float)p1.field_0._28_4_ * fVar86 + (float)p0.field_0._28_4_ * fVar130;
        fVar143 = (float)p1.field_0._32_4_ * fVar60;
        fVar132 = (float)p1.field_0._36_4_ * fVar82;
        fVar140 = (float)p1.field_0._40_4_ * fVar84;
        fVar144 = (float)p1.field_0._44_4_ * fVar86;
        uVar41 = uVar43;
        RVar51 = RVar45;
        while (uVar41 != 0) {
          uVar55 = (ulong)*(uint *)(lVar54 + 0x10 + (long)valid_i * 4);
          auVar65 = *(undefined1 (*) [16])
                     ((long)(*(RTCRayQueryContext **)((long)RVar52 + 0xe0))
                            [(long)itime.field_0.i[(long)RVar51] * 7] + uVar55 * 4);
          puVar2 = (undefined4 *)
                   ((long)(*(RTCRayQueryContext **)((long)RVar52 + 0xe0))
                          [(long)itime.field_0.i[(long)RVar51] * 7 + 7] + uVar55 * 4);
          uVar13 = *puVar2;
          uVar14 = puVar2[1];
          uVar15 = puVar2[2];
          *(int *)((long)&p0.field_0 + (long)RVar51 * 4) = auVar65._0_4_;
          uVar44 = extractps(auVar65,1);
          *(undefined8 *)((long)&p0.field_0 + (long)RVar51 * 4 + 0x10) = uVar44;
          uVar44 = extractps(auVar65,2);
          *(undefined8 *)((long)&p0.field_0 + (long)RVar51 * 4 + 0x20) = uVar44;
          *(undefined4 *)((long)&p1.field_0 + (long)RVar51 * 4) = uVar13;
          *(undefined4 *)((long)&p1.field_0 + (long)RVar51 * 4 + 0x10) = uVar14;
          *(undefined4 *)((long)&p1.field_0 + (long)RVar51 * 4 + 0x20) = uVar15;
          uVar41 = uVar41 ^ 1L << ((ulong)RVar51 & 0x3f);
          RVar51.instID[0] = 0;
          RVar51.instPrimID[0] = 0;
          if (uVar41 != 0) {
            for (; (uVar41 >> (long)RVar51 & 1) == 0;
                RVar51 = (RTCRayQueryContext)((long)RVar51 + 1)) {
            }
          }
        }
        local_1b08 = (float)uVar40 * fVar60 + (float)uVar28 * fVar85;
        fStack_1b04 = (float)uVar25 * fVar82 + (float)uVar29 * fVar118;
        fStack_1b00 = (float)uVar26 * fVar84 + (float)uVar30 * fVar141;
        fStack_1afc = (float)uVar27 * fVar86 + (float)uVar31 * fVar130;
        uVar28 = p0.field_0._0_4_;
        uVar29 = p0.field_0._4_4_;
        uVar30 = p0.field_0._8_4_;
        uVar31 = p0.field_0._12_4_;
        uVar13 = p0.field_0._32_4_;
        uVar14 = p0.field_0._36_4_;
        uVar15 = p0.field_0._40_4_;
        uVar37 = p0.field_0._44_4_;
        uVar40 = p1.field_0._0_4_;
        uVar25 = p1.field_0._4_4_;
        uVar26 = p1.field_0._8_4_;
        uVar27 = p1.field_0._12_4_;
        fVar59 = (float)p1.field_0._16_4_ * fVar60 + (float)p0.field_0._16_4_ * fVar85;
        fVar81 = (float)p1.field_0._20_4_ * fVar82 + (float)p0.field_0._20_4_ * fVar118;
        fVar83 = (float)p1.field_0._24_4_ * fVar84 + (float)p0.field_0._24_4_ * fVar141;
        fVar126 = (float)p1.field_0._28_4_ * fVar86 + (float)p0.field_0._28_4_ * fVar130;
        fVar175 = (float)p1.field_0._32_4_ * fVar60;
        fVar180 = (float)p1.field_0._36_4_ * fVar82;
        fVar182 = (float)p1.field_0._40_4_ * fVar84;
        fVar185 = (float)p1.field_0._44_4_ * fVar86;
        uVar41 = uVar43;
        RVar49 = RVar45;
        while (uVar41 != 0) {
          uVar55 = (ulong)*(uint *)(lVar54 + 0x20 + (long)valid_i * 4);
          puVar2 = (undefined4 *)
                   ((long)(*(RTCRayQueryContext **)((long)RVar52 + 0xe0))
                          [(long)itime.field_0.i[(long)RVar49] * 7] + uVar55 * 4);
          uVar16 = puVar2[1];
          uVar17 = puVar2[2];
          auVar65 = *(undefined1 (*) [16])
                     ((long)(*(RTCRayQueryContext **)((long)RVar52 + 0xe0))
                            [(long)itime.field_0.i[(long)RVar49] * 7 + 7] + uVar55 * 4);
          *(undefined4 *)((long)&p0.field_0 + (long)RVar49 * 4) = *puVar2;
          *(undefined4 *)((long)&p0.field_0 + (long)RVar49 * 4 + 0x10) = uVar16;
          *(undefined4 *)((long)&p0.field_0 + (long)RVar49 * 4 + 0x20) = uVar17;
          *(int *)((long)&p1.field_0 + (long)RVar49 * 4) = auVar65._0_4_;
          uVar44 = extractps(auVar65,1);
          *(undefined8 *)((long)&p1.field_0 + (long)RVar49 * 4 + 0x10) = uVar44;
          uVar44 = extractps(auVar65,2);
          *(undefined8 *)((long)&p1.field_0 + (long)RVar49 * 4 + 0x20) = uVar44;
          uVar41 = uVar41 ^ 1L << ((ulong)RVar49 & 0x3f);
          RVar49.instID[0] = 0;
          RVar49.instPrimID[0] = 0;
          if (uVar41 != 0) {
            for (; (uVar41 >> (long)RVar49 & 1) == 0;
                RVar49 = (RTCRayQueryContext)((long)RVar49 + 1)) {
            }
          }
        }
        fVar128 = (float)uVar40 * fVar60 + (float)uVar28 * fVar85;
        fVar138 = (float)uVar25 * fVar82 + (float)uVar29 * fVar118;
        fVar139 = (float)uVar26 * fVar84 + (float)uVar30 * fVar141;
        fVar146 = (float)uVar27 * fVar86 + (float)uVar31 * fVar130;
        uVar28 = p0.field_0._0_4_;
        uVar29 = p0.field_0._4_4_;
        uVar30 = p0.field_0._8_4_;
        uVar31 = p0.field_0._12_4_;
        uVar16 = p0.field_0._32_4_;
        uVar17 = p0.field_0._36_4_;
        uVar35 = p0.field_0._40_4_;
        uVar38 = p0.field_0._44_4_;
        uVar40 = p1.field_0._0_4_;
        uVar25 = p1.field_0._4_4_;
        uVar26 = p1.field_0._8_4_;
        uVar27 = p1.field_0._12_4_;
        local_1958 = (float)p1.field_0._16_4_ * fVar60 + (float)p0.field_0._16_4_ * fVar85;
        fStack_1954 = (float)p1.field_0._20_4_ * fVar82 + (float)p0.field_0._20_4_ * fVar118;
        fStack_1950 = (float)p1.field_0._24_4_ * fVar84 + (float)p0.field_0._24_4_ * fVar141;
        fStack_194c = (float)p1.field_0._28_4_ * fVar86 + (float)p0.field_0._28_4_ * fVar130;
        local_1948 = (float)p1.field_0._32_4_ * fVar60;
        fStack_1944 = (float)p1.field_0._36_4_ * fVar82;
        fStack_1940 = (float)p1.field_0._40_4_ * fVar84;
        fStack_193c = (float)p1.field_0._44_4_ * fVar86;
        uVar41 = uVar43;
        while (uVar41 != 0) {
          RVar49 = (*(RTCRayQueryContext **)((long)RVar52 + 0xe0))
                   [(long)itime.field_0.i[(long)RVar45] * 7 + 7];
          uVar55 = (ulong)*(uint *)(lVar54 + 0x30 + (long)valid_i * 4);
          auVar65 = *(undefined1 (*) [16])
                     ((long)(*(RTCRayQueryContext **)((long)RVar52 + 0xe0))
                            [(long)itime.field_0.i[(long)RVar45] * 7] + uVar55 * 4);
          auVar106 = *(undefined1 (*) [16])((long)RVar49 + uVar55 * 4);
          *(int *)((long)&p0.field_0 + (long)RVar45 * 4) = auVar65._0_4_;
          uVar44 = extractps(auVar65,1);
          *(undefined8 *)((long)&p0.field_0 + (long)RVar45 * 4 + 0x10) = uVar44;
          uVar44 = extractps(auVar65,2);
          *(undefined8 *)((long)&p0.field_0 + (long)RVar45 * 4 + 0x20) = uVar44;
          *(int *)((long)&p1.field_0 + (long)RVar45 * 4) = auVar106._0_4_;
          uVar44 = extractps(auVar106,1);
          *(undefined8 *)((long)&p1.field_0 + (long)RVar45 * 4 + 0x10) = uVar44;
          uVar44 = extractps(auVar106,2);
          *(undefined8 *)((long)&p1.field_0 + (long)RVar45 * 4 + 0x20) = uVar44;
          uVar41 = uVar41 ^ 1L << ((ulong)RVar45 & 0x3f);
          RVar45.instID[0] = 0;
          RVar45.instPrimID[0] = 0;
          if (uVar41 != 0) {
            for (; (uVar41 >> (long)RVar45 & 1) == 0;
                RVar45 = (RTCRayQueryContext)((long)RVar45 + 1)) {
            }
          }
        }
        fVar143 = (float)uVar32 * fVar85 + fVar143;
        fVar132 = (float)uVar33 * fVar118 + fVar132;
        fVar140 = (float)uVar34 * fVar141 + fVar140;
        fVar144 = (float)uVar36 * fVar130 + fVar144;
        fVar175 = (float)uVar13 * fVar85 + fVar175;
        fVar180 = (float)uVar14 * fVar118 + fVar180;
        fVar182 = (float)uVar15 * fVar141 + fVar182;
        fVar185 = (float)uVar37 * fVar130 + fVar185;
        local_1948 = (float)uVar16 * fVar85 + local_1948;
        fStack_1944 = (float)uVar17 * fVar118 + fStack_1944;
        fStack_1940 = (float)uVar35 * fVar141 + fStack_1940;
        fStack_193c = (float)uVar38 * fVar130 + fStack_193c;
        local_1938 = (float)uVar40 * fVar60 + (float)uVar28 * fVar85;
        fStack_1934 = (float)uVar25 * fVar82 + (float)uVar29 * fVar118;
        fStack_1930 = (float)uVar26 * fVar84 + (float)uVar30 * fVar141;
        fStack_192c = (float)uVar27 * fVar86 + (float)uVar31 * fVar130;
        fVar158 = (float)p1.field_0._0_4_ * fVar60 + (float)p0.field_0._0_4_ * fVar85;
        fVar160 = (float)p1.field_0._4_4_ * fVar82 + (float)p0.field_0._4_4_ * fVar118;
        fVar162 = (float)p1.field_0._8_4_ * fVar84 + (float)p0.field_0._8_4_ * fVar141;
        fVar164 = (float)p1.field_0._12_4_ * fVar86 + (float)p0.field_0._12_4_ * fVar130;
        fVar169 = (float)p1.field_0._16_4_ * fVar60 + (float)p0.field_0._16_4_ * fVar85;
        fVar171 = (float)p1.field_0._20_4_ * fVar82 + (float)p0.field_0._20_4_ * fVar118;
        fVar203 = (float)p1.field_0._24_4_ * fVar84 + (float)p0.field_0._24_4_ * fVar141;
        fVar213 = (float)p1.field_0._28_4_ * fVar86 + (float)p0.field_0._28_4_ * fVar130;
        fVar60 = fVar60 * (float)p1.field_0._32_4_ + fVar85 * (float)p0.field_0._32_4_;
        fVar82 = fVar82 * (float)p1.field_0._36_4_ + fVar118 * (float)p0.field_0._36_4_;
        fVar84 = fVar84 * (float)p1.field_0._40_4_ + fVar141 * (float)p0.field_0._40_4_;
        fVar86 = fVar86 * (float)p1.field_0._44_4_ + fVar130 * (float)p0.field_0._44_4_;
      }
      fVar85 = *(float *)ray;
      fVar118 = *(float *)(ray + 4);
      fVar141 = *(float *)(ray + 8);
      fVar130 = *(float *)(ray + 0xc);
      fVar166 = *(float *)(ray + 0x10);
      fVar88 = *(float *)(ray + 0x14);
      fVar99 = *(float *)(ray + 0x18);
      fVar101 = *(float *)(ray + 0x1c);
      fVar103 = *(float *)(ray + 0x20);
      fVar100 = *(float *)(ray + 0x24);
      fVar102 = *(float *)(ray + 0x28);
      fVar104 = *(float *)(ray + 0x2c);
      auVar65 = *(undefined1 (*) [16])(ray + 0x40);
      fVar240 = auVar65._0_4_;
      fVar244 = auVar65._4_4_;
      fVar245 = auVar65._8_4_;
      fVar246 = auVar65._12_4_;
      local_1b28 = (float)*(undefined8 *)(ray + 0x50);
      fStack_1b24 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      fStack_1b20 = (float)*(undefined8 *)(ray + 0x58);
      fStack_1b1c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      local_1b08 = local_1b08 - fVar85;
      fStack_1b04 = fStack_1b04 - fVar118;
      fStack_1b00 = fStack_1b00 - fVar141;
      fStack_1afc = fStack_1afc - fVar130;
      fVar145 = fVar145 - fVar166;
      fVar173 = fVar173 - fVar88;
      fVar238 = fVar238 - fVar99;
      fVar239 = fVar239 - fVar101;
      fVar143 = fVar143 - fVar103;
      fVar132 = fVar132 - fVar100;
      fVar140 = fVar140 - fVar102;
      fVar144 = fVar144 - fVar104;
      fVar224 = fVar128 - fVar85;
      fVar232 = fVar138 - fVar118;
      fVar234 = fVar139 - fVar141;
      fVar236 = fVar146 - fVar130;
      fVar188 = fVar59 - fVar166;
      fVar192 = fVar81 - fVar88;
      fVar194 = fVar83 - fVar99;
      fVar196 = fVar126 - fVar101;
      fVar165 = fVar175 - fVar103;
      fVar170 = fVar180 - fVar100;
      fVar172 = fVar182 - fVar102;
      fVar174 = fVar185 - fVar104;
      fVar85 = fVar158 - fVar85;
      fVar118 = fVar160 - fVar118;
      fVar141 = fVar162 - fVar141;
      fVar130 = fVar164 - fVar130;
      fVar166 = fVar169 - fVar166;
      fVar88 = fVar171 - fVar88;
      fVar99 = fVar203 - fVar99;
      fVar101 = fVar213 - fVar101;
      fVar103 = fVar60 - fVar103;
      fVar100 = fVar82 - fVar100;
      fVar102 = fVar84 - fVar102;
      fVar104 = fVar86 - fVar104;
      fVar198 = fVar85 - local_1b08;
      fVar204 = fVar118 - fStack_1b04;
      fVar208 = fVar141 - fStack_1b00;
      fVar214 = fVar130 - fStack_1afc;
      fVar105 = fVar166 - fVar145;
      fVar115 = fVar88 - fVar173;
      fVar116 = fVar99 - fVar238;
      fVar117 = fVar101 - fVar239;
      fVar225 = fVar103 - fVar143;
      fVar233 = fVar100 - fVar132;
      fVar235 = fVar102 - fVar140;
      fVar237 = fVar104 - fVar144;
      auVar20 = *(undefined1 (*) [12])(ray + 0x60);
      fVar211 = *(float *)(ray + 0x6c);
      fVar199 = local_1b08 - fVar224;
      fVar205 = fStack_1b04 - fVar232;
      fVar209 = fStack_1b00 - fVar234;
      fVar215 = fStack_1afc - fVar236;
      fVar176 = fVar145 - fVar188;
      fVar181 = fVar173 - fVar192;
      fVar183 = fVar238 - fVar194;
      fVar186 = fVar239 - fVar196;
      fVar247 = (fVar105 * (fVar103 + fVar143) - (fVar166 + fVar145) * fVar225) * fVar240 +
                ((fVar85 + local_1b08) * fVar225 - (fVar103 + fVar143) * fVar198) * local_1b28 +
                (fVar198 * (fVar166 + fVar145) - (fVar85 + local_1b08) * fVar105) *
                *(float *)(ray + 0x60);
      fVar250 = (fVar115 * (fVar100 + fVar132) - (fVar88 + fVar173) * fVar233) * fVar244 +
                ((fVar118 + fStack_1b04) * fVar233 - (fVar100 + fVar132) * fVar204) * fStack_1b24 +
                (fVar204 * (fVar88 + fVar173) - (fVar118 + fStack_1b04) * fVar115) *
                *(float *)(ray + 100);
      fVar251 = (fVar116 * (fVar102 + fVar140) - (fVar99 + fVar238) * fVar235) * fVar245 +
                ((fVar141 + fStack_1b00) * fVar235 - (fVar102 + fVar140) * fVar208) * fStack_1b20 +
                (fVar208 * (fVar99 + fVar238) - (fVar141 + fStack_1b00) * fVar116) *
                *(float *)(ray + 0x68);
      fVar252 = (fVar117 * (fVar104 + fVar144) - (fVar101 + fVar239) * fVar237) * fVar246 +
                ((fVar130 + fStack_1afc) * fVar237 - (fVar104 + fVar144) * fVar214) * fStack_1b1c +
                (fVar214 * (fVar101 + fVar239) - (fVar130 + fStack_1afc) * fVar117) * fVar211;
      fVar216 = fVar143 - fVar165;
      fVar218 = fVar132 - fVar170;
      fVar220 = fVar140 - fVar172;
      fVar222 = fVar144 - fVar174;
      fVar200 = auVar20._0_4_;
      fVar206 = auVar20._4_4_;
      fVar210 = auVar20._8_4_;
      auVar189._0_4_ =
           (fVar176 * (fVar143 + fVar165) - (fVar145 + fVar188) * fVar216) * fVar240 +
           ((local_1b08 + fVar224) * fVar216 - (fVar143 + fVar165) * fVar199) * local_1b28 +
           (fVar199 * (fVar145 + fVar188) - (local_1b08 + fVar224) * fVar176) * fVar200;
      auVar189._4_4_ =
           (fVar181 * (fVar132 + fVar170) - (fVar173 + fVar192) * fVar218) * fVar244 +
           ((fStack_1b04 + fVar232) * fVar218 - (fVar132 + fVar170) * fVar205) * fStack_1b24 +
           (fVar205 * (fVar173 + fVar192) - (fStack_1b04 + fVar232) * fVar181) * fVar206;
      auVar189._8_4_ =
           (fVar183 * (fVar140 + fVar172) - (fVar238 + fVar194) * fVar220) * fVar245 +
           ((fStack_1b00 + fVar234) * fVar220 - (fVar140 + fVar172) * fVar209) * fStack_1b20 +
           (fVar209 * (fVar238 + fVar194) - (fStack_1b00 + fVar234) * fVar183) * fVar210;
      auVar189._12_4_ =
           (fVar186 * (fVar144 + fVar174) - (fVar239 + fVar196) * fVar222) * fVar246 +
           ((fStack_1afc + fVar236) * fVar222 - (fVar144 + fVar174) * fVar215) * fStack_1b1c +
           (fVar215 * (fVar239 + fVar196) - (fStack_1afc + fVar236) * fVar186) * fVar211;
      fVar119 = fVar224 - fVar85;
      fVar127 = fVar232 - fVar118;
      fVar129 = fVar234 - fVar141;
      fVar131 = fVar236 - fVar130;
      fVar147 = fVar188 - fVar166;
      fVar159 = fVar192 - fVar88;
      fVar161 = fVar194 - fVar99;
      fVar163 = fVar196 - fVar101;
      fVar217 = fVar165 - fVar103;
      fVar219 = fVar170 - fVar100;
      fVar221 = fVar172 - fVar102;
      fVar223 = fVar174 - fVar104;
      auVar226._0_4_ =
           (fVar147 * (fVar103 + fVar165) - (fVar166 + fVar188) * fVar217) * fVar240 +
           ((fVar85 + fVar224) * fVar217 - (fVar103 + fVar165) * fVar119) * local_1b28 +
           (fVar119 * (fVar166 + fVar188) - (fVar85 + fVar224) * fVar147) * fVar200;
      auVar226._4_4_ =
           (fVar159 * (fVar100 + fVar170) - (fVar88 + fVar192) * fVar219) * fVar244 +
           ((fVar118 + fVar232) * fVar219 - (fVar100 + fVar170) * fVar127) * fStack_1b24 +
           (fVar127 * (fVar88 + fVar192) - (fVar118 + fVar232) * fVar159) * fVar206;
      auVar226._8_4_ =
           (fVar161 * (fVar102 + fVar172) - (fVar99 + fVar194) * fVar221) * fVar245 +
           ((fVar141 + fVar234) * fVar221 - (fVar102 + fVar172) * fVar129) * fStack_1b20 +
           (fVar129 * (fVar99 + fVar194) - (fVar141 + fVar234) * fVar161) * fVar210;
      auVar226._12_4_ =
           (fVar163 * (fVar104 + fVar174) - (fVar101 + fVar196) * fVar223) * fVar246 +
           ((fVar130 + fVar236) * fVar223 - (fVar104 + fVar174) * fVar131) * fStack_1b1c +
           (fVar131 * (fVar101 + fVar196) - (fVar130 + fVar236) * fVar163) * fVar211;
      auVar111._0_4_ = fVar247 + auVar189._0_4_ + auVar226._0_4_;
      auVar111._4_4_ = fVar250 + auVar189._4_4_ + auVar226._4_4_;
      auVar111._8_4_ = fVar251 + auVar189._8_4_ + auVar226._8_4_;
      auVar111._12_4_ = fVar252 + auVar189._12_4_ + auVar226._12_4_;
      auVar67._8_4_ = fVar251;
      auVar67._0_8_ = CONCAT44(fVar250,fVar247);
      auVar67._12_4_ = fVar252;
      auVar65 = minps(auVar67,auVar189);
      auVar65 = minps(auVar65,auVar226);
      auVar150._8_4_ = fVar251;
      auVar150._0_8_ = CONCAT44(fVar250,fVar247);
      auVar150._12_4_ = fVar252;
      auVar106 = maxps(auVar150,auVar189);
      auVar106 = maxps(auVar106,auVar226);
      uVar41 = CONCAT44(auVar111._4_4_,auVar111._0_4_);
      fVar85 = ABS(auVar111._8_4_) * 1.1920929e-07;
      fVar118 = ABS(auVar111._12_4_) * 1.1920929e-07;
      auVar151._4_4_ = -(uint)(auVar106._4_4_ <= ABS(auVar111._4_4_) * 1.1920929e-07);
      auVar151._0_4_ = -(uint)(auVar106._0_4_ <= ABS(auVar111._0_4_) * 1.1920929e-07);
      auVar151._8_4_ = -(uint)(auVar106._8_4_ <= fVar85);
      auVar151._12_4_ = -(uint)(auVar106._12_4_ <= fVar118);
      auVar68._4_4_ = -(uint)(-(ABS(auVar111._4_4_) * 1.1920929e-07) <= auVar65._4_4_);
      auVar68._0_4_ = -(uint)(-(ABS(auVar111._0_4_) * 1.1920929e-07) <= auVar65._0_4_);
      auVar68._8_4_ = -(uint)(-fVar85 <= auVar65._8_4_);
      auVar68._12_4_ = -(uint)(-fVar118 <= auVar65._12_4_);
      auVar151 = auVar151 | auVar68;
      local_1b18 = auVar148._0_4_;
      uStack_1b14 = auVar148._4_4_;
      uStack_1b10 = auVar148._8_4_;
      uStack_1b0c = auVar148._12_4_;
      auVar152._0_4_ = auVar151._0_4_ & local_1b18;
      auVar152._4_4_ = auVar151._4_4_ & uStack_1b14;
      auVar152._8_4_ = auVar151._8_4_ & uStack_1b10;
      auVar152._12_4_ = auVar151._12_4_ & uStack_1b0c;
      iVar46 = movmskps(RVar45.instID[0],auVar152);
      if (iVar46 != 0) {
        auVar179._0_4_ = fVar176 * fVar217 - fVar147 * fVar216;
        auVar179._4_4_ = fVar181 * fVar219 - fVar159 * fVar218;
        auVar179._8_4_ = fVar183 * fVar221 - fVar161 * fVar220;
        auVar179._12_4_ = fVar186 * fVar223 - fVar163 * fVar222;
        auVar69._4_4_ = -(uint)(ABS(fVar181 * fVar233) < ABS(fVar159 * fVar218));
        auVar69._0_4_ = -(uint)(ABS(fVar176 * fVar225) < ABS(fVar147 * fVar216));
        auVar69._8_4_ = -(uint)(ABS(fVar183 * fVar235) < ABS(fVar161 * fVar220));
        auVar69._12_4_ = -(uint)(ABS(fVar186 * fVar237) < ABS(fVar163 * fVar222));
        auVar12._4_4_ = fVar115 * fVar218 - fVar181 * fVar233;
        auVar12._0_4_ = fVar105 * fVar216 - fVar176 * fVar225;
        auVar12._8_4_ = fVar116 * fVar220 - fVar183 * fVar235;
        auVar12._12_4_ = fVar117 * fVar222 - fVar186 * fVar237;
        auVar120 = blendvps(auVar179,auVar12,auVar69);
        auVar248._0_4_ = fVar225 * fVar199 - fVar198 * fVar216;
        auVar248._4_4_ = fVar233 * fVar205 - fVar204 * fVar218;
        auVar248._8_4_ = fVar235 * fVar209 - fVar208 * fVar220;
        auVar248._12_4_ = fVar237 * fVar215 - fVar214 * fVar222;
        auVar121._0_4_ = fVar119 * fVar216 - fVar199 * fVar217;
        auVar121._4_4_ = fVar127 * fVar218 - fVar205 * fVar219;
        auVar121._8_4_ = fVar129 * fVar220 - fVar209 * fVar221;
        auVar121._12_4_ = fVar131 * fVar222 - fVar215 * fVar223;
        auVar70._4_4_ = -(uint)(ABS(fVar204 * fVar218) < ABS(fVar205 * fVar219));
        auVar70._0_4_ = -(uint)(ABS(fVar198 * fVar216) < ABS(fVar199 * fVar217));
        auVar70._8_4_ = -(uint)(ABS(fVar208 * fVar220) < ABS(fVar209 * fVar221));
        auVar70._12_4_ = -(uint)(ABS(fVar214 * fVar222) < ABS(fVar215 * fVar223));
        auVar106 = blendvps(auVar121,auVar248,auVar70);
        auVar190._0_4_ = fVar198 * fVar176 - fVar199 * fVar105;
        auVar190._4_4_ = fVar204 * fVar181 - fVar205 * fVar115;
        auVar190._8_4_ = fVar208 * fVar183 - fVar209 * fVar116;
        auVar190._12_4_ = fVar214 * fVar186 - fVar215 * fVar117;
        auVar167._0_4_ = fVar199 * fVar147 - fVar119 * fVar176;
        auVar167._4_4_ = fVar205 * fVar159 - fVar127 * fVar181;
        auVar167._8_4_ = fVar209 * fVar161 - fVar129 * fVar183;
        auVar167._12_4_ = fVar215 * fVar163 - fVar131 * fVar186;
        auVar71._4_4_ = -(uint)(ABS(fVar205 * fVar115) < ABS(fVar127 * fVar181));
        auVar71._0_4_ = -(uint)(ABS(fVar199 * fVar105) < ABS(fVar119 * fVar176));
        auVar71._8_4_ = -(uint)(ABS(fVar209 * fVar116) < ABS(fVar129 * fVar183));
        auVar71._12_4_ = -(uint)(ABS(fVar215 * fVar117) < ABS(fVar131 * fVar186));
        auVar168 = blendvps(auVar167,auVar190,auVar71);
        fVar85 = fVar240 * auVar120._0_4_ + local_1b28 * auVar106._0_4_ + fVar200 * auVar168._0_4_;
        fVar118 = fVar244 * auVar120._4_4_ + fStack_1b24 * auVar106._4_4_ + fVar206 * auVar168._4_4_
        ;
        fVar141 = fVar245 * auVar120._8_4_ + fStack_1b20 * auVar106._8_4_ + fVar210 * auVar168._8_4_
        ;
        fVar130 = fVar246 * auVar120._12_4_ +
                  fStack_1b1c * auVar106._12_4_ + fVar211 * auVar168._12_4_;
        auVar241._0_4_ = fVar85 + fVar85;
        auVar241._4_4_ = fVar118 + fVar118;
        auVar241._8_4_ = fVar141 + fVar141;
        auVar241._12_4_ = fVar130 + fVar130;
        auVar72._0_4_ = fVar145 * auVar106._0_4_ + fVar143 * auVar168._0_4_;
        auVar72._4_4_ = fVar173 * auVar106._4_4_ + fVar132 * auVar168._4_4_;
        auVar72._8_4_ = fVar238 * auVar106._8_4_ + fVar140 * auVar168._8_4_;
        auVar72._12_4_ = fVar239 * auVar106._12_4_ + fVar144 * auVar168._12_4_;
        fVar143 = local_1b08 * auVar120._0_4_ + auVar72._0_4_;
        fVar132 = fStack_1b04 * auVar120._4_4_ + auVar72._4_4_;
        fVar140 = fStack_1b00 * auVar120._8_4_ + auVar72._8_4_;
        fVar144 = fStack_1afc * auVar120._12_4_ + auVar72._12_4_;
        auVar65 = rcpps(auVar72,auVar241);
        fVar85 = auVar65._0_4_;
        fVar118 = auVar65._4_4_;
        fVar141 = auVar65._8_4_;
        fVar130 = auVar65._12_4_;
        fVar85 = ((1.0 - auVar241._0_4_ * fVar85) * fVar85 + fVar85) * (fVar143 + fVar143);
        fVar118 = ((1.0 - auVar241._4_4_ * fVar118) * fVar118 + fVar118) * (fVar132 + fVar132);
        fVar141 = ((1.0 - auVar241._8_4_ * fVar141) * fVar141 + fVar141) * (fVar140 + fVar140);
        fVar130 = ((1.0 - auVar241._12_4_ * fVar130) * fVar130 + fVar130) * (fVar144 + fVar144);
        auVar242._0_4_ =
             (int)((uint)(auVar241._0_4_ != 0.0 &&
                         (fVar85 <= *(float *)(ray + 0x80) && *(float *)(ray + 0x30) <= fVar85)) *
                  -0x80000000) >> 0x1f;
        auVar242._4_4_ =
             (int)((uint)(auVar241._4_4_ != 0.0 &&
                         (fVar118 <= *(float *)(ray + 0x84) && *(float *)(ray + 0x34) <= fVar118)) *
                  -0x80000000) >> 0x1f;
        auVar242._8_4_ =
             (int)((uint)(auVar241._8_4_ != 0.0 &&
                         (fVar141 <= *(float *)(ray + 0x88) && *(float *)(ray + 0x38) <= fVar141)) *
                  -0x80000000) >> 0x1f;
        auVar242._12_4_ =
             (int)((uint)(auVar241._12_4_ != 0.0 &&
                         (fVar130 <= *(float *)(ray + 0x8c) && *(float *)(ray + 0x3c) <= fVar130)) *
                  -0x80000000) >> 0x1f;
        iVar46 = movmskps(iVar46,auVar242 & auVar152);
        if (iVar46 != 0) {
          uVar197 = *(uint *)((long)RVar52 + 0x34);
          auVar227._0_4_ = -(uint)((uVar197 & *(uint *)(ray + 0x90)) == 0);
          auVar227._4_4_ = -(uint)((uVar197 & *(uint *)(ray + 0x94)) == 0);
          auVar227._8_4_ = -(uint)((uVar197 & *(uint *)(ray + 0x98)) == 0);
          auVar227._12_4_ = -(uint)((uVar197 & *(uint *)(ray + 0x9c)) == 0);
          auVar228 = ~auVar227 & auVar242 & auVar152;
          iVar46 = movmskps(iVar46,auVar228);
          if (iVar46 != 0) {
            uVar44 = context->args;
            if ((*(long *)&(((Scene *)uVar44)->super_AccelN).super_Accel.super_AccelData.bounds.
                           bounds0.lower.field_0 != 0) ||
               (((RayQueryContext *)((long)RVar52 + 0x48))->scene != (Scene *)0x0)) {
              auVar65 = rcpps(ZEXT416(uVar197),auVar111);
              fVar85 = auVar65._0_4_;
              fVar118 = auVar65._4_4_;
              fVar141 = auVar65._8_4_;
              fVar130 = auVar65._12_4_;
              fVar132 = (float)DAT_01f46a60;
              fVar140 = DAT_01f46a60._4_4_;
              fVar144 = DAT_01f46a60._12_4_;
              fVar143 = DAT_01f46a60._8_4_;
              local_1778 = (float)(uVar41 & 0x7fffffff7fffffff);
              fStack_1774 = (float)((uVar41 & 0x7fffffff7fffffff) >> 0x20);
              fVar85 = (float)(-(uint)(1e-18 <= local_1778) &
                              (uint)((fVar132 - auVar111._0_4_ * fVar85) * fVar85 + fVar85));
              fVar118 = (float)(-(uint)(1e-18 <= fStack_1774) &
                               (uint)((fVar140 - auVar111._4_4_ * fVar118) * fVar118 + fVar118));
              fVar141 = (float)(-(uint)(1e-18 <= ABS(auVar111._8_4_)) &
                               (uint)((fVar143 - auVar111._8_4_ * fVar141) * fVar141 + fVar141));
              fVar130 = (float)(-(uint)(1e-18 <= ABS(auVar111._12_4_)) &
                               (uint)((fVar144 - auVar111._12_4_ * fVar130) * fVar130 + fVar130));
              auVar142._0_4_ = fVar247 * fVar85;
              auVar142._4_4_ = fVar250 * fVar118;
              auVar142._8_4_ = fVar251 * fVar141;
              auVar142._12_4_ = fVar252 * fVar130;
              auVar65 = minps(auVar142,_DAT_01f46a60);
              auVar154._0_4_ = auVar189._0_4_ * fVar85;
              auVar154._4_4_ = auVar189._4_4_ * fVar118;
              auVar154._8_4_ = auVar189._8_4_ * fVar141;
              auVar154._12_4_ = auVar189._12_4_ * fVar130;
              auVar90 = minps(auVar154,_DAT_01f46a60);
              auVar113._0_4_ = fVar132 - auVar65._0_4_;
              auVar113._4_4_ = fVar140 - auVar65._4_4_;
              auVar113._8_4_ = fVar143 - auVar65._8_4_;
              auVar113._12_4_ = fVar144 - auVar65._12_4_;
              auVar136._0_4_ = fVar132 - auVar90._0_4_;
              auVar136._4_4_ = fVar140 - auVar90._4_4_;
              auVar136._8_4_ = fVar143 - auVar90._8_4_;
              auVar136._12_4_ = fVar144 - auVar90._12_4_;
              auVar19._8_8_ = uVar22;
              auVar19._0_8_ = uVar21;
              blendvps(auVar65,auVar113,auVar19);
              blendvps(auVar90,auVar136,auVar19);
              p1.field_0._0_8_ = &itime;
              p1.field_0._8_8_ = &t;
              p1.field_0._16_8_ = &v_1;
              p1.field_0._24_8_ = &u;
              p0.field_0._0_16_ = auVar120;
              p0.field_0._16_16_ = auVar106;
              p0.field_0._32_16_ = auVar168;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                 *)&p0);
              p0.field_0._4_4_ = itime.field_0.i[1];
              p0.field_0._0_4_ = itime.field_0.i[0];
              p0.field_0._12_4_ = itime.field_0.i[3];
              p0.field_0._8_4_ = itime.field_0.i[2];
              p0.field_0._24_8_ = uStack_1910;
              p0.field_0._16_8_ = local_1918;
              p0.field_0._40_8_ = uStack_1900;
              p0.field_0._32_8_ = local_1908;
              auVar65 = *(undefined1 (*) [16])(ray + 0x80);
              auVar106 = blendvps(auVar65,(undefined1  [16])t.field_0,auVar228);
              *(undefined1 (*) [16])(ray + 0x80) = auVar106;
              p1.field_0._0_8_ = local_1a68;
              p1.field_0._8_8_ = ((RayQueryContext *)((long)RVar52 + 0x18))->scene;
              p1.field_0._16_8_ = context->user;
              p1.field_0._32_8_ = &p0;
              p1.field_0._40_4_ = 4;
              uVar44 = ((RayQueryContext *)((long)RVar52 + 0x48))->scene;
              p1.field_0._24_8_ = ray;
              local_1a68 = auVar228;
              if ((Scene *)uVar44 != (Scene *)0x0) {
                uVar44 = (*(code *)uVar44)(&p1);
              }
              if (local_1a68 == (undefined1  [16])0x0) {
                auVar94._8_4_ = 0xffffffff;
                auVar94._0_8_ = 0xffffffffffffffff;
                auVar94._12_4_ = 0xffffffff;
                auVar94 = auVar94 ^ _DAT_01f46b70;
              }
              else {
                p_Var7 = context->args->filter;
                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)((long)RVar52 + 0x3e) & 0x40) != 0)
                    ))) {
                  (*p_Var7)((RTCFilterFunctionNArguments *)&p1);
                  RVar52 = extraout_RDX;
                }
                auVar78._0_4_ = -(uint)(local_1a68._0_4_ == 0);
                auVar78._4_4_ = -(uint)(local_1a68._4_4_ == 0);
                auVar78._8_4_ = -(uint)(local_1a68._8_4_ == 0);
                auVar78._12_4_ = -(uint)(local_1a68._12_4_ == 0);
                auVar94 = auVar78 ^ _DAT_01f46b70;
                auVar106 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),
                                    auVar78);
                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar106;
                uVar44 = p1.field_0._24_8_;
              }
              auVar95._0_4_ = auVar94._0_4_ << 0x1f;
              auVar95._4_4_ = auVar94._4_4_ << 0x1f;
              auVar95._8_4_ = auVar94._8_4_ << 0x1f;
              auVar95._12_4_ = auVar94._12_4_ << 0x1f;
              auVar228._0_4_ = auVar95._0_4_ >> 0x1f;
              auVar228._4_4_ = auVar95._4_4_ >> 0x1f;
              auVar228._8_4_ = auVar95._8_4_ >> 0x1f;
              auVar228._12_4_ = auVar95._12_4_ >> 0x1f;
              auVar65 = blendvps(auVar65,*(undefined1 (*) [16])(ray + 0x80),auVar95);
              *(undefined1 (*) [16])(ray + 0x80) = auVar65;
              RVar49 = RVar52;
            }
            iVar46 = (int)uVar44;
            auVar148 = ~auVar228 & auVar148;
          }
        }
      }
      iVar46 = movmskps(iVar46,auVar148);
      if (iVar46 == 0) {
        iVar46 = 0;
        goto LAB_006d1490;
      }
      fVar85 = *(float *)ray;
      fVar118 = *(float *)(ray + 4);
      fVar141 = *(float *)(ray + 8);
      fVar130 = *(float *)(ray + 0xc);
      fVar143 = *(float *)(ray + 0x10);
      fVar132 = *(float *)(ray + 0x14);
      fVar140 = *(float *)(ray + 0x18);
      fVar144 = *(float *)(ray + 0x1c);
      fVar145 = *(float *)(ray + 0x20);
      fVar173 = *(float *)(ray + 0x24);
      fVar238 = *(float *)(ray + 0x28);
      fVar239 = *(float *)(ray + 0x2c);
      auVar20 = *(undefined1 (*) [12])(ray + 0x50);
      fVar166 = *(float *)(ray + 0x5c);
      local_1938 = local_1938 - fVar85;
      fStack_1934 = fStack_1934 - fVar118;
      fStack_1930 = fStack_1930 - fVar141;
      fStack_192c = fStack_192c - fVar130;
      local_1958 = local_1958 - fVar143;
      fStack_1954 = fStack_1954 - fVar132;
      fStack_1950 = fStack_1950 - fVar140;
      fStack_194c = fStack_194c - fVar144;
      local_1948 = local_1948 - fVar145;
      fStack_1944 = fStack_1944 - fVar173;
      fStack_1940 = fStack_1940 - fVar238;
      fStack_193c = fStack_193c - fVar239;
      fVar158 = fVar158 - fVar85;
      fVar160 = fVar160 - fVar118;
      fVar162 = fVar162 - fVar141;
      fVar164 = fVar164 - fVar130;
      fVar169 = fVar169 - fVar143;
      fVar171 = fVar171 - fVar132;
      fVar203 = fVar203 - fVar140;
      fVar213 = fVar213 - fVar144;
      fVar60 = fVar60 - fVar145;
      fVar82 = fVar82 - fVar173;
      fVar84 = fVar84 - fVar238;
      fVar86 = fVar86 - fVar239;
      fVar128 = fVar128 - fVar85;
      fVar138 = fVar138 - fVar118;
      fVar139 = fVar139 - fVar141;
      fVar146 = fVar146 - fVar130;
      fVar59 = fVar59 - fVar143;
      fVar81 = fVar81 - fVar132;
      fVar83 = fVar83 - fVar140;
      fVar126 = fVar126 - fVar144;
      fVar175 = fVar175 - fVar145;
      fVar180 = fVar180 - fVar173;
      fVar182 = fVar182 - fVar238;
      fVar185 = fVar185 - fVar239;
      fVar101 = fVar128 - local_1938;
      fVar100 = fVar138 - fStack_1934;
      fVar104 = fVar139 - fStack_1930;
      fVar105 = fVar146 - fStack_192c;
      fVar116 = fVar59 - local_1958;
      fVar127 = fVar81 - fStack_1954;
      fVar147 = fVar83 - fStack_1950;
      fVar161 = fVar126 - fStack_194c;
      fVar188 = fVar175 - local_1948;
      fVar194 = fVar180 - fStack_1944;
      fVar198 = fVar182 - fStack_1940;
      fVar200 = fVar185 - fStack_193c;
      fVar85 = *(float *)(ray + 0x60);
      uVar44 = *(undefined8 *)(ray + 0x60);
      fVar118 = *(float *)(ray + 0x68);
      fVar141 = *(float *)(ray + 0x6c);
      fVar103 = local_1938 - fVar158;
      fVar102 = fStack_1934 - fVar160;
      fVar211 = fStack_1930 - fVar162;
      fVar115 = fStack_192c - fVar164;
      fVar192 = local_1958 - fVar169;
      fVar196 = fStack_1954 - fVar171;
      fVar199 = fStack_1950 - fVar203;
      fVar204 = fStack_194c - fVar213;
      local_1b08 = (float)*(undefined8 *)(ray + 0x40);
      fStack_1b04 = (float)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      fStack_1b00 = (float)*(undefined8 *)(ray + 0x48);
      fStack_1afc = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      fVar238 = (fVar116 * (fVar175 + local_1948) - (fVar59 + local_1958) * fVar188) * local_1b08 +
                ((fVar128 + local_1938) * fVar188 - (fVar175 + local_1948) * fVar101) *
                *(float *)(ray + 0x50) +
                (fVar101 * (fVar59 + local_1958) - (fVar128 + local_1938) * fVar116) * fVar85;
      fVar239 = (fVar127 * (fVar180 + fStack_1944) - (fVar81 + fStack_1954) * fVar194) * fStack_1b04
                + ((fVar138 + fStack_1934) * fVar194 - (fVar180 + fStack_1944) * fVar100) *
                  *(float *)(ray + 0x54) +
                  (fVar100 * (fVar81 + fStack_1954) - (fVar138 + fStack_1934) * fVar127) *
                  *(float *)(ray + 100);
      fVar88 = (fVar147 * (fVar182 + fStack_1940) - (fVar83 + fStack_1950) * fVar198) * fStack_1b00
               + ((fVar139 + fStack_1930) * fVar198 - (fVar182 + fStack_1940) * fVar104) *
                 *(float *)(ray + 0x58) +
                 (fVar104 * (fVar83 + fStack_1950) - (fVar139 + fStack_1930) * fVar147) * fVar118;
      fVar99 = (fVar161 * (fVar185 + fStack_193c) - (fVar126 + fStack_194c) * fVar200) * fStack_1afc
               + ((fVar146 + fStack_192c) * fVar200 - (fVar185 + fStack_193c) * fVar105) * fVar166 +
                 (fVar105 * (fVar126 + fStack_194c) - (fVar146 + fStack_192c) * fVar161) * fVar141;
      fVar117 = local_1948 - fVar60;
      fVar129 = fStack_1944 - fVar82;
      fVar159 = fStack_1940 - fVar84;
      fVar163 = fStack_193c - fVar86;
      fVar119 = (float)uVar44;
      fVar131 = (float)((ulong)uVar44 >> 0x20);
      fVar130 = auVar20._0_4_;
      fVar143 = auVar20._4_4_;
      fVar132 = auVar20._8_4_;
      auVar153._0_4_ =
           (fVar192 * (local_1948 + fVar60) - (local_1958 + fVar169) * fVar117) * local_1b08 +
           ((local_1938 + fVar158) * fVar117 - (local_1948 + fVar60) * fVar103) * fVar130 +
           (fVar103 * (local_1958 + fVar169) - (local_1938 + fVar158) * fVar192) * fVar119;
      auVar153._4_4_ =
           (fVar196 * (fStack_1944 + fVar82) - (fStack_1954 + fVar171) * fVar129) * fStack_1b04 +
           ((fStack_1934 + fVar160) * fVar129 - (fStack_1944 + fVar82) * fVar102) * fVar143 +
           (fVar102 * (fStack_1954 + fVar171) - (fStack_1934 + fVar160) * fVar196) * fVar131;
      auVar153._8_4_ =
           (fVar199 * (fStack_1940 + fVar84) - (fStack_1950 + fVar203) * fVar159) * fStack_1b00 +
           ((fStack_1930 + fVar162) * fVar159 - (fStack_1940 + fVar84) * fVar211) * fVar132 +
           (fVar211 * (fStack_1950 + fVar203) - (fStack_1930 + fVar162) * fVar199) * fVar118;
      auVar153._12_4_ =
           (fVar204 * (fStack_193c + fVar86) - (fStack_194c + fVar213) * fVar163) * fStack_1afc +
           ((fStack_192c + fVar164) * fVar163 - (fStack_193c + fVar86) * fVar115) * fVar166 +
           (fVar115 * (fStack_194c + fVar213) - (fStack_192c + fVar164) * fVar204) * fVar141;
      fVar176 = fVar158 - fVar128;
      fVar181 = fVar160 - fVar138;
      fVar183 = fVar162 - fVar139;
      fVar186 = fVar164 - fVar146;
      fVar165 = fVar169 - fVar59;
      fVar170 = fVar171 - fVar81;
      fVar172 = fVar203 - fVar83;
      fVar174 = fVar213 - fVar126;
      fVar140 = fVar60 - fVar175;
      fVar144 = fVar82 - fVar180;
      fVar145 = fVar84 - fVar182;
      fVar173 = fVar86 - fVar185;
      auVar73._0_4_ =
           (fVar165 * (fVar175 + fVar60) - (fVar59 + fVar169) * fVar140) * local_1b08 +
           ((fVar128 + fVar158) * fVar140 - (fVar175 + fVar60) * fVar176) * fVar130 +
           (fVar176 * (fVar59 + fVar169) - (fVar128 + fVar158) * fVar165) * fVar119;
      auVar73._4_4_ =
           (fVar170 * (fVar180 + fVar82) - (fVar81 + fVar171) * fVar144) * fStack_1b04 +
           ((fVar138 + fVar160) * fVar144 - (fVar180 + fVar82) * fVar181) * fVar143 +
           (fVar181 * (fVar81 + fVar171) - (fVar138 + fVar160) * fVar170) * fVar131;
      auVar73._8_4_ =
           (fVar172 * (fVar182 + fVar84) - (fVar83 + fVar203) * fVar145) * fStack_1b00 +
           ((fVar139 + fVar162) * fVar145 - (fVar182 + fVar84) * fVar183) * fVar132 +
           (fVar183 * (fVar83 + fVar203) - (fVar139 + fVar162) * fVar172) * fVar118;
      auVar73._12_4_ =
           (fVar174 * (fVar185 + fVar86) - (fVar126 + fVar213) * fVar173) * fStack_1afc +
           ((fVar146 + fVar164) * fVar173 - (fVar185 + fVar86) * fVar186) * fVar166 +
           (fVar186 * (fVar126 + fVar213) - (fVar146 + fVar164) * fVar174) * fVar141;
      auVar112._0_4_ = fVar238 + auVar153._0_4_ + auVar73._0_4_;
      auVar112._4_4_ = fVar239 + auVar153._4_4_ + auVar73._4_4_;
      auVar112._8_4_ = fVar88 + auVar153._8_4_ + auVar73._8_4_;
      auVar112._12_4_ = fVar99 + auVar153._12_4_ + auVar73._12_4_;
      auVar92._8_4_ = fVar88;
      auVar92._0_8_ = CONCAT44(fVar239,fVar238);
      auVar92._12_4_ = fVar99;
      auVar65 = minps(auVar92,auVar153);
      auVar65 = minps(auVar65,auVar73);
      auVar122._8_4_ = fVar88;
      auVar122._0_8_ = CONCAT44(fVar239,fVar238);
      auVar122._12_4_ = fVar99;
      auVar106 = maxps(auVar122,auVar153);
      auVar106 = maxps(auVar106,auVar73);
      uVar197 = (uint)DAT_01f46710;
      uVar202 = DAT_01f46710._4_4_;
      uVar207 = DAT_01f46710._8_4_;
      uVar212 = DAT_01f46710._12_4_;
      fVar60 = (float)((uint)auVar112._0_4_ & uVar197) * 1.1920929e-07;
      fVar82 = (float)((uint)auVar112._4_4_ & uVar202) * 1.1920929e-07;
      fVar84 = (float)((uint)auVar112._8_4_ & uVar207) * 1.1920929e-07;
      fVar86 = (float)((uint)auVar112._12_4_ & uVar212) * 1.1920929e-07;
      auVar123._4_4_ = -(uint)(auVar106._4_4_ <= fVar82);
      auVar123._0_4_ = -(uint)(auVar106._0_4_ <= fVar60);
      auVar123._8_4_ = -(uint)(auVar106._8_4_ <= fVar84);
      auVar123._12_4_ = -(uint)(auVar106._12_4_ <= fVar86);
      auVar93._4_4_ = -(uint)(-fVar82 <= auVar65._4_4_);
      auVar93._0_4_ = -(uint)(-fVar60 <= auVar65._0_4_);
      auVar93._8_4_ = -(uint)(-fVar84 <= auVar65._8_4_);
      auVar93._12_4_ = -(uint)(-fVar86 <= auVar65._12_4_);
      auVar123 = auVar123 | auVar93;
      auVar124._0_4_ = auVar123._0_4_ & auVar148._0_4_;
      auVar124._4_4_ = auVar123._4_4_ & auVar148._4_4_;
      auVar124._8_4_ = auVar123._8_4_ & auVar148._8_4_;
      auVar124._12_4_ = auVar123._12_4_ & auVar148._12_4_;
      iVar46 = movmskps(iVar46,auVar124);
      if (iVar46 == 0) {
        iVar46 = 0;
      }
      else {
        auVar133._0_4_ = fVar116 * fVar117 - fVar192 * fVar188;
        auVar133._4_4_ = fVar127 * fVar129 - fVar196 * fVar194;
        auVar133._8_4_ = fVar147 * fVar159 - fVar199 * fVar198;
        auVar133._12_4_ = fVar161 * fVar163 - fVar204 * fVar200;
        auVar249._0_4_ = fVar192 * fVar140 - fVar165 * fVar117;
        auVar249._4_4_ = fVar196 * fVar144 - fVar170 * fVar129;
        auVar249._8_4_ = fVar199 * fVar145 - fVar172 * fVar159;
        auVar249._12_4_ = fVar204 * fVar173 - fVar174 * fVar163;
        auVar74._4_4_ =
             -(uint)((float)((uint)(fVar196 * fVar194) & uVar202) <
                    (float)((uint)(fVar170 * fVar129) & uVar202));
        auVar74._0_4_ =
             -(uint)((float)((uint)(fVar192 * fVar188) & uVar197) <
                    (float)((uint)(fVar165 * fVar117) & uVar197));
        auVar74._8_4_ =
             -(uint)((float)((uint)(fVar199 * fVar198) & uVar207) <
                    (float)((uint)(fVar172 * fVar159) & uVar207));
        auVar74._12_4_ =
             -(uint)((float)((uint)(fVar204 * fVar200) & uVar212) <
                    (float)((uint)(fVar174 * fVar163) & uVar212));
        auVar120 = blendvps(auVar249,auVar133,auVar74);
        auVar229._0_4_ = fVar188 * fVar103 - fVar101 * fVar117;
        auVar229._4_4_ = fVar194 * fVar102 - fVar100 * fVar129;
        auVar229._8_4_ = fVar198 * fVar211 - fVar104 * fVar159;
        auVar229._12_4_ = fVar200 * fVar115 - fVar105 * fVar163;
        auVar243._0_4_ = fVar176 * fVar117 - fVar103 * fVar140;
        auVar243._4_4_ = fVar181 * fVar129 - fVar102 * fVar144;
        auVar243._8_4_ = fVar183 * fVar159 - fVar211 * fVar145;
        auVar243._12_4_ = fVar186 * fVar163 - fVar115 * fVar173;
        auVar75._4_4_ =
             -(uint)((float)((uint)(fVar100 * fVar129) & uVar202) <
                    (float)((uint)(fVar102 * fVar144) & uVar202));
        auVar75._0_4_ =
             -(uint)((float)((uint)(fVar101 * fVar117) & uVar197) <
                    (float)((uint)(fVar103 * fVar140) & uVar197));
        auVar75._8_4_ =
             -(uint)((float)((uint)(fVar104 * fVar159) & uVar207) <
                    (float)((uint)(fVar211 * fVar145) & uVar207));
        auVar75._12_4_ =
             -(uint)((float)((uint)(fVar105 * fVar163) & uVar212) <
                    (float)((uint)(fVar115 * fVar173) & uVar212));
        auVar168 = blendvps(auVar243,auVar229,auVar75);
        auVar201._0_4_ = fVar103 * fVar165 - fVar176 * fVar192;
        auVar201._4_4_ = fVar102 * fVar170 - fVar181 * fVar196;
        auVar201._8_4_ = fVar211 * fVar172 - fVar183 * fVar199;
        auVar201._12_4_ = fVar115 * fVar174 - fVar186 * fVar204;
        auVar76._4_4_ =
             -(uint)((float)((uint)(fVar102 * fVar127) & uVar202) <
                    (float)((uint)(fVar181 * fVar196) & uVar202));
        auVar76._0_4_ =
             -(uint)((float)((uint)(fVar103 * fVar116) & uVar197) <
                    (float)((uint)(fVar176 * fVar192) & uVar197));
        auVar76._8_4_ =
             -(uint)((float)((uint)(fVar211 * fVar147) & uVar207) <
                    (float)((uint)(fVar183 * fVar199) & uVar207));
        auVar76._12_4_ =
             -(uint)((float)((uint)(fVar115 * fVar161) & uVar212) <
                    (float)((uint)(fVar186 * fVar204) & uVar212));
        auVar11._4_4_ = fVar100 * fVar196 - fVar102 * fVar127;
        auVar11._0_4_ = fVar101 * fVar192 - fVar103 * fVar116;
        auVar11._8_4_ = fVar104 * fVar199 - fVar211 * fVar147;
        auVar11._12_4_ = fVar105 * fVar204 - fVar115 * fVar161;
        auVar106 = blendvps(auVar201,auVar11,auVar76);
        fVar60 = local_1b08 * auVar120._0_4_ + fVar130 * auVar168._0_4_ + fVar85 * auVar106._0_4_;
        fVar82 = fStack_1b04 * auVar120._4_4_ +
                 fVar143 * auVar168._4_4_ + *(float *)(ray + 100) * auVar106._4_4_;
        fVar84 = fStack_1b00 * auVar120._8_4_ + fVar132 * auVar168._8_4_ + fVar118 * auVar106._8_4_;
        fVar86 = fStack_1afc * auVar120._12_4_ +
                 fVar166 * auVar168._12_4_ + fVar141 * auVar106._12_4_;
        auVar134._0_4_ = fVar60 + fVar60;
        auVar134._4_4_ = fVar82 + fVar82;
        auVar134._8_4_ = fVar84 + fVar84;
        auVar134._12_4_ = fVar86 + fVar86;
        auVar77._0_4_ = local_1958 * auVar168._0_4_ + local_1948 * auVar106._0_4_;
        auVar77._4_4_ = fStack_1954 * auVar168._4_4_ + fStack_1944 * auVar106._4_4_;
        auVar77._8_4_ = fStack_1950 * auVar168._8_4_ + fStack_1940 * auVar106._8_4_;
        auVar77._12_4_ = fStack_194c * auVar168._12_4_ + fStack_193c * auVar106._12_4_;
        fVar85 = local_1938 * auVar120._0_4_ + auVar77._0_4_;
        fVar118 = fStack_1934 * auVar120._4_4_ + auVar77._4_4_;
        fVar141 = fStack_1930 * auVar120._8_4_ + auVar77._8_4_;
        fVar130 = fStack_192c * auVar120._12_4_ + auVar77._12_4_;
        auVar65 = rcpps(auVar77,auVar134);
        fVar60 = auVar65._0_4_;
        fVar82 = auVar65._4_4_;
        fVar84 = auVar65._8_4_;
        fVar86 = auVar65._12_4_;
        fVar60 = ((1.0 - auVar134._0_4_ * fVar60) * fVar60 + fVar60) * (fVar85 + fVar85);
        fVar82 = ((1.0 - auVar134._4_4_ * fVar82) * fVar82 + fVar82) * (fVar118 + fVar118);
        fVar84 = ((1.0 - auVar134._8_4_ * fVar84) * fVar84 + fVar84) * (fVar141 + fVar141);
        fVar86 = ((1.0 - auVar134._12_4_ * fVar86) * fVar86 + fVar86) * (fVar130 + fVar130);
        auVar135._0_4_ =
             (int)((uint)(auVar134._0_4_ != 0.0 &&
                         (fVar60 <= *(float *)(ray + 0x80) && *(float *)(ray + 0x30) <= fVar60)) *
                  -0x80000000) >> 0x1f;
        auVar135._4_4_ =
             (int)((uint)(auVar134._4_4_ != 0.0 &&
                         (fVar82 <= *(float *)(ray + 0x84) && *(float *)(ray + 0x34) <= fVar82)) *
                  -0x80000000) >> 0x1f;
        auVar135._8_4_ =
             (int)((uint)(auVar134._8_4_ != 0.0 &&
                         (fVar84 <= *(float *)(ray + 0x88) && *(float *)(ray + 0x38) <= fVar84)) *
                  -0x80000000) >> 0x1f;
        auVar135._12_4_ =
             (int)((uint)(auVar134._12_4_ != 0.0 &&
                         (fVar86 <= *(float *)(ray + 0x8c) && *(float *)(ray + 0x3c) <= fVar86)) *
                  -0x80000000) >> 0x1f;
        iVar46 = movmskps(iVar46,auVar135 & auVar124);
        if (iVar46 == 0) {
          iVar46 = 0;
        }
        else {
          pRVar5 = (context->scene->geometries).items;
          pGVar6 = pRVar5[*(uint *)(lVar54 + 0x40 + (long)valid_i * 4)].ptr;
          uVar184 = pGVar6->mask;
          auVar230._0_4_ = -(uint)((uVar184 & *(uint *)(ray + 0x90)) == 0);
          auVar230._4_4_ = -(uint)((uVar184 & *(uint *)(ray + 0x94)) == 0);
          auVar230._8_4_ = -(uint)((uVar184 & *(uint *)(ray + 0x98)) == 0);
          auVar230._12_4_ = -(uint)((uVar184 & *(uint *)(ray + 0x9c)) == 0);
          auVar231 = ~auVar230 & auVar135 & auVar124;
          iVar46 = movmskps((int)pRVar5,auVar231);
          if (iVar46 != 0) {
            uVar44 = context->args;
            if ((((RTCIntersectArguments *)uVar44)->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar65 = rcpps(ZEXT416(uVar184),auVar112);
              fVar60 = auVar65._0_4_;
              fVar82 = auVar65._4_4_;
              fVar84 = auVar65._8_4_;
              fVar86 = auVar65._12_4_;
              fVar118 = (float)DAT_01f46a60;
              fVar141 = DAT_01f46a60._4_4_;
              fVar130 = DAT_01f46a60._12_4_;
              fVar85 = DAT_01f46a60._8_4_;
              fVar60 = (float)(-(uint)(1e-18 <= (float)((uint)auVar112._0_4_ & uVar197)) &
                              (uint)((fVar118 - auVar112._0_4_ * fVar60) * fVar60 + fVar60));
              fVar82 = (float)(-(uint)(1e-18 <= (float)((uint)auVar112._4_4_ & uVar202)) &
                              (uint)((fVar141 - auVar112._4_4_ * fVar82) * fVar82 + fVar82));
              fVar84 = (float)(-(uint)(1e-18 <= (float)((uint)auVar112._8_4_ & uVar207)) &
                              (uint)((fVar85 - auVar112._8_4_ * fVar84) * fVar84 + fVar84));
              fVar86 = (float)(-(uint)(1e-18 <= (float)((uint)auVar112._12_4_ & uVar212)) &
                              (uint)((fVar130 - auVar112._12_4_ * fVar86) * fVar86 + fVar86));
              auVar137._0_4_ = fVar238 * fVar60;
              auVar137._4_4_ = fVar239 * fVar82;
              auVar137._8_4_ = fVar88 * fVar84;
              auVar137._12_4_ = fVar99 * fVar86;
              auVar65 = minps(auVar137,_DAT_01f46a60);
              auVar155._0_4_ = auVar153._0_4_ * fVar60;
              auVar155._4_4_ = auVar153._4_4_ * fVar82;
              auVar155._8_4_ = auVar153._8_4_ * fVar84;
              auVar155._12_4_ = auVar153._12_4_ * fVar86;
              auVar90 = minps(auVar155,_DAT_01f46a60);
              auVar114._0_4_ = fVar118 - auVar65._0_4_;
              auVar114._4_4_ = fVar141 - auVar65._4_4_;
              auVar114._8_4_ = fVar85 - auVar65._8_4_;
              auVar114._12_4_ = fVar130 - auVar65._12_4_;
              auVar125._0_4_ = fVar118 - auVar90._0_4_;
              auVar125._4_4_ = fVar141 - auVar90._4_4_;
              auVar125._8_4_ = fVar85 - auVar90._8_4_;
              auVar125._12_4_ = fVar130 - auVar90._12_4_;
              auVar18._8_8_ = uVar24;
              auVar18._0_8_ = uVar23;
              blendvps(auVar65,auVar114,auVar18);
              blendvps(auVar90,auVar125,auVar18);
              p1.field_0._0_8_ = &itime;
              p1.field_0._8_8_ = &t;
              p1.field_0._16_8_ = &v_1;
              p1.field_0._24_8_ = &u;
              p0.field_0._0_16_ = auVar120;
              p0.field_0._16_16_ = auVar168;
              p0.field_0._32_16_ = auVar106;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                 *)&p0);
              p0.field_0._4_4_ = itime.field_0.i[1];
              p0.field_0._0_4_ = itime.field_0.i[0];
              p0.field_0._12_4_ = itime.field_0.i[3];
              p0.field_0._8_4_ = itime.field_0.i[2];
              p0.field_0._24_8_ = uStack_1910;
              p0.field_0._16_8_ = local_1918;
              p0.field_0._40_8_ = uStack_1900;
              p0.field_0._32_8_ = local_1908;
              auVar65 = *(undefined1 (*) [16])(ray + 0x80);
              auVar106 = blendvps(auVar65,(undefined1  [16])t.field_0,auVar231);
              *(undefined1 (*) [16])(ray + 0x80) = auVar106;
              p1.field_0._0_8_ = local_1a68;
              p1.field_0._8_8_ = pGVar6->userPtr;
              p1.field_0._16_8_ = context->user;
              p1.field_0._32_8_ = &p0;
              p1.field_0._40_4_ = 4;
              uVar44 = pGVar6->occlusionFilterN;
              RVar49 = (RTCRayQueryContext)context;
              p1.field_0._24_8_ = ray;
              local_1a68 = auVar231;
              if ((RTCIntersectArguments *)uVar44 != (RTCIntersectArguments *)0x0) {
                auVar106 = (*(code *)uVar44)(&p1);
                RVar49 = auVar106._8_8_;
                uVar44 = auVar106._0_8_;
              }
              if (local_1a68 == (undefined1  [16])0x0) {
                auVar96._8_4_ = 0xffffffff;
                auVar96._0_8_ = 0xffffffffffffffff;
                auVar96._12_4_ = 0xffffffff;
                auVar96 = auVar96 ^ _DAT_01f46b70;
              }
              else {
                p_Var7 = context->args->filter;
                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var7)((RTCFilterFunctionNArguments *)&p1);
                  RVar49 = extraout_RDX_00;
                }
                auVar79._0_4_ = -(uint)(local_1a68._0_4_ == 0);
                auVar79._4_4_ = -(uint)(local_1a68._4_4_ == 0);
                auVar79._8_4_ = -(uint)(local_1a68._8_4_ == 0);
                auVar79._12_4_ = -(uint)(local_1a68._12_4_ == 0);
                auVar96 = auVar79 ^ _DAT_01f46b70;
                auVar106 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),
                                    auVar79);
                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar106;
                uVar44 = p1.field_0._24_8_;
              }
              auVar97._0_4_ = auVar96._0_4_ << 0x1f;
              auVar97._4_4_ = auVar96._4_4_ << 0x1f;
              auVar97._8_4_ = auVar96._8_4_ << 0x1f;
              auVar97._12_4_ = auVar96._12_4_ << 0x1f;
              auVar231._0_4_ = auVar97._0_4_ >> 0x1f;
              auVar231._4_4_ = auVar97._4_4_ >> 0x1f;
              auVar231._8_4_ = auVar97._8_4_ >> 0x1f;
              auVar231._12_4_ = auVar97._12_4_ >> 0x1f;
              auVar65 = blendvps(auVar65,*(undefined1 (*) [16])(ray + 0x80),auVar97);
              *(undefined1 (*) [16])(ray + 0x80) = auVar65;
            }
            iVar46 = (int)uVar44;
            auVar148 = ~auVar231 & auVar148;
          }
        }
      }
      uVar197 = movmskps(iVar46,auVar148);
      uVar41 = (ulong)uVar197;
      valid_i = (vint<4> *)((long)&((Intersectors *)valid_i)->ptr + 1);
    } while (uVar197 != 0);
    iVar46 = 0;
LAB_006d1490:
    auVar156._0_4_ = auVar149._0_4_ & auVar148._0_4_;
    auVar156._4_4_ = auVar149._4_4_ & auVar148._4_4_;
    auVar156._8_4_ = auVar149._8_4_ & auVar148._8_4_;
    auVar156._12_4_ = auVar149._12_4_ & auVar148._12_4_;
    iVar46 = movmskps(iVar46,auVar156);
    pTVar42 = (TravRayK<4,_true> *)((long)(pTVar42->org).field_0.field_0.x.field_0.v + 1);
    tray_00 = pTVar42;
    auVar149 = auVar156;
  } while (iVar46 != 0);
  auVar157._0_8_ = auVar156._0_8_ ^ 0xffffffffffffffff;
  auVar157._8_4_ = auVar156._8_4_ ^ 0xffffffff;
  auVar157._12_4_ = auVar156._12_4_ ^ 0xffffffff;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       (auVar157 | (undefined1  [16])terminated.field_0);
  uVar197 = movmskps((int)pTVar42,(undefined1  [16])terminated.field_0);
  if (uVar197 == 0xf) goto LAB_006d15aa;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                (undefined1  [16])terminated.field_0);
  goto LAB_006cfa5a;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }